

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  uint uVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  long lVar79;
  undefined4 uVar80;
  uint uVar81;
  undefined8 unaff_R13;
  long lVar82;
  bool bVar83;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar86 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar109 [16];
  float fVar107;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined8 uVar108;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar130;
  float fVar132;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar136;
  undefined1 auVar143 [16];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar144 [32];
  undefined1 auVar137 [16];
  float fVar155;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar183;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar187 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [28];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar238 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar243 [16];
  undefined1 auVar247 [64];
  float fVar248;
  float fVar256;
  float fVar257;
  undefined1 auVar249 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar250 [32];
  float fVar258;
  float fVar262;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  float fVar263;
  undefined1 auVar264 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar265 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b6c;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  RTCFilterFunctionNArguments local_af8;
  int local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_9f0;
  float local_9e8;
  float local_9e4;
  undefined4 local_9e0;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  uint local_9d0;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 auStack_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar75 = (ulong)(byte)PVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar75 * 4 + 6);
  local_840 = vpmovsxbd_avx2(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar75 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar5);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar75 * 6 + 6);
  auVar147 = vpmovsxbd_avx2(auVar189);
  lVar82 = uVar75 * 0x25;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar75 * 0xf + 6);
  auVar145 = vpmovsxbd_avx2(auVar205);
  auVar124._1_3_ = 0;
  auVar124[0] = PVar7;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar15 = vpmovsxbd_avx2(auVar88);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar75 * 0x11 + 6);
  auVar16 = vpmovsxbd_avx2(auVar213);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar75 * 0x1a + 6);
  auVar199 = vpmovsxbd_avx2(auVar238);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar75 * 0x1b + 6);
  auVar220 = vpmovsxbd_avx2(auVar142);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar75 * 0x1c + 6);
  auVar17 = vpmovsxbd_avx2(auVar6);
  auVar4 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                      *(undefined1 (*) [16])(prim + lVar82 + 6));
  fVar136 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar82 + 0x16)) *
            *(float *)(prim + lVar82 + 0x1a);
  fVar248 = *(float *)(prim + lVar82 + 0x12);
  auVar249._0_4_ = fVar248 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar249._4_4_ = fVar248 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar249._8_4_ = fVar248 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar249._12_4_ = fVar248 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar139._0_4_ = fVar248 * auVar4._0_4_;
  auVar139._4_4_ = fVar248 * auVar4._4_4_;
  auVar139._8_4_ = fVar248 * auVar4._8_4_;
  auVar139._12_4_ = fVar248 * auVar4._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar14 = vcvtdq2ps_avx(auVar220);
  auVar98 = vcvtdq2ps_avx(auVar17);
  auVar4 = vmovshdup_avx(auVar249);
  auVar195._0_8_ = auVar4._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  auVar4 = vshufps_avx(auVar249,auVar249,0xaa);
  fVar248 = auVar4._0_4_;
  fVar256 = auVar4._4_4_;
  auVar176._4_4_ = fVar256 * auVar147._4_4_;
  auVar176._0_4_ = fVar248 * auVar147._0_4_;
  auVar176._8_4_ = fVar248 * auVar147._8_4_;
  auVar176._12_4_ = fVar256 * auVar147._12_4_;
  auVar176._16_4_ = fVar248 * auVar147._16_4_;
  auVar176._20_4_ = fVar256 * auVar147._20_4_;
  auVar176._24_4_ = fVar248 * auVar147._24_4_;
  auVar176._28_4_ = auVar17._28_4_;
  auVar17._4_4_ = fVar256 * auVar16._4_4_;
  auVar17._0_4_ = fVar248 * auVar16._0_4_;
  auVar17._8_4_ = fVar248 * auVar16._8_4_;
  auVar17._12_4_ = fVar256 * auVar16._12_4_;
  auVar17._16_4_ = fVar248 * auVar16._16_4_;
  auVar17._20_4_ = fVar256 * auVar16._20_4_;
  auVar17._24_4_ = fVar248 * auVar16._24_4_;
  auVar17._28_4_ = auVar220._28_4_;
  auVar220._4_4_ = auVar98._4_4_ * fVar256;
  auVar220._0_4_ = auVar98._0_4_ * fVar248;
  auVar220._8_4_ = auVar98._8_4_ * fVar248;
  auVar220._12_4_ = auVar98._12_4_ * fVar256;
  auVar220._16_4_ = auVar98._16_4_ * fVar248;
  auVar220._20_4_ = auVar98._20_4_ * fVar256;
  auVar220._24_4_ = auVar98._24_4_ * fVar248;
  auVar220._28_4_ = fVar256;
  auVar5 = vfmadd231ps_fma(auVar176,auVar195,auVar96);
  auVar189 = vfmadd231ps_fma(auVar17,auVar195,auVar15);
  auVar205 = vfmadd231ps_fma(auVar220,auVar14,auVar195);
  auVar4 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar248 = auVar4._0_4_;
  auVar196._0_4_ = fVar248 * auVar147._0_4_;
  fVar256 = auVar4._4_4_;
  auVar196._4_4_ = fVar256 * auVar147._4_4_;
  auVar196._8_4_ = fVar248 * auVar147._8_4_;
  auVar196._12_4_ = fVar256 * auVar147._12_4_;
  auVar196._16_4_ = fVar248 * auVar147._16_4_;
  auVar196._20_4_ = fVar256 * auVar147._20_4_;
  auVar196._24_4_ = fVar248 * auVar147._24_4_;
  auVar196._28_4_ = 0;
  auVar147._4_4_ = fVar256 * auVar16._4_4_;
  auVar147._0_4_ = fVar248 * auVar16._0_4_;
  auVar147._8_4_ = fVar248 * auVar16._8_4_;
  auVar147._12_4_ = fVar256 * auVar16._12_4_;
  auVar147._16_4_ = fVar248 * auVar16._16_4_;
  auVar147._20_4_ = fVar256 * auVar16._20_4_;
  auVar147._24_4_ = fVar248 * auVar16._24_4_;
  auVar147._28_4_ = auVar16._28_4_;
  auVar16._4_4_ = auVar98._4_4_ * fVar256;
  auVar16._0_4_ = auVar98._0_4_ * fVar248;
  auVar16._8_4_ = auVar98._8_4_ * fVar248;
  auVar16._12_4_ = auVar98._12_4_ * fVar256;
  auVar16._16_4_ = auVar98._16_4_ * fVar248;
  auVar16._20_4_ = auVar98._20_4_ * fVar256;
  auVar16._24_4_ = auVar98._24_4_ * fVar248;
  auVar16._28_4_ = auVar98._28_4_;
  auVar4 = vmovshdup_avx(auVar139);
  auVar94._0_8_ = auVar4._0_8_;
  auVar94._8_8_ = auVar94._0_8_;
  auVar94._16_8_ = auVar94._0_8_;
  auVar94._24_8_ = auVar94._0_8_;
  auVar4 = vfmadd231ps_fma(auVar196,auVar94,auVar96);
  local_860 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 7 + 6));
  auVar88 = vfmadd231ps_fma(auVar147,auVar94,auVar15);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0xb + 6));
  auVar213 = vfmadd231ps_fma(auVar16,auVar94,auVar14);
  auVar220 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 9 + 6));
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0xd + 6));
  auVar96 = vcvtdq2ps_avx(local_840);
  auVar147 = vcvtdq2ps_avx(auVar145);
  auVar15 = vcvtdq2ps_avx(auVar199);
  auVar250._4_4_ = auVar249._0_4_;
  auVar250._0_4_ = auVar249._0_4_;
  auVar250._8_4_ = auVar249._0_4_;
  auVar250._12_4_ = auVar249._0_4_;
  auVar250._16_4_ = auVar249._0_4_;
  auVar250._20_4_ = auVar249._0_4_;
  auVar250._24_4_ = auVar249._0_4_;
  auVar250._28_4_ = auVar249._0_4_;
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar250,auVar96);
  auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar250,auVar147);
  auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),auVar15,auVar250);
  auVar145 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x12 + 6));
  auVar233._4_4_ = auVar139._0_4_;
  auVar233._0_4_ = auVar139._0_4_;
  auVar233._8_4_ = auVar139._0_4_;
  auVar233._12_4_ = auVar139._0_4_;
  auVar233._16_4_ = auVar139._0_4_;
  auVar233._20_4_ = auVar139._0_4_;
  auVar233._24_4_ = auVar139._0_4_;
  auVar233._28_4_ = auVar139._0_4_;
  auVar139 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar233,auVar96);
  auVar249 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar233,auVar147);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar233,auVar15);
  local_6c0._8_4_ = 0x7fffffff;
  local_6c0._0_8_ = 0x7fffffff7fffffff;
  local_6c0._12_4_ = 0x7fffffff;
  local_6c0._16_4_ = 0x7fffffff;
  local_6c0._20_4_ = 0x7fffffff;
  local_6c0._24_4_ = 0x7fffffff;
  local_6c0._28_4_ = 0x7fffffff;
  auVar96 = vandps_avx(ZEXT1632(auVar5),local_6c0);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar122,1);
  auVar147 = vblendvps_avx(ZEXT1632(auVar5),auVar122,auVar96);
  auVar96 = vandps_avx(ZEXT1632(auVar189),local_6c0);
  auVar96 = vcmpps_avx(auVar96,auVar122,1);
  auVar15 = vblendvps_avx(ZEXT1632(auVar189),auVar122,auVar96);
  auVar96 = vandps_avx(local_6c0,ZEXT1632(auVar205));
  auVar96 = vcmpps_avx(auVar96,auVar122,1);
  auVar96 = vblendvps_avx(ZEXT1632(auVar205),auVar122,auVar96);
  auVar199 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x16 + 6));
  auVar216._4_4_ = fVar136;
  auVar216._0_4_ = fVar136;
  auVar216._8_4_ = fVar136;
  auVar216._12_4_ = fVar136;
  auVar216._16_4_ = fVar136;
  auVar216._20_4_ = fVar136;
  auVar216._24_4_ = fVar136;
  auVar216._28_4_ = fVar136;
  auVar16 = vcvtdq2ps_avx(local_860);
  auVar14 = vcvtdq2ps_avx(auVar98);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar205 = vfmadd213ps_fma(auVar14,auVar216,auVar16);
  auVar16 = vcvtdq2ps_avx(auVar220);
  auVar14 = vcvtdq2ps_avx(auVar17);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar88 = vfmadd213ps_fma(auVar14,auVar216,auVar16);
  auVar16 = vcvtdq2ps_avx(auVar145);
  auVar14 = vcvtdq2ps_avx(auVar199);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar213 = vfmadd213ps_fma(auVar14,auVar216,auVar16);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x14 + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x18 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar238 = vfmadd213ps_fma(auVar14,auVar216,auVar16);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x1d + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x21 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar142 = vfmadd213ps_fma(auVar14,auVar216,auVar16);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x1f + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  local_7e8 = prim;
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x23 + 6));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar98 = vsubps_avx(auVar14,auVar16);
  auVar14 = vrcpps_avx(auVar147);
  auVar6 = vfmadd213ps_fma(auVar98,auVar216,auVar16);
  auVar255 = ZEXT1664(auVar6);
  auVar123._8_4_ = 0x3f800000;
  auVar123._0_8_ = 0x3f8000003f800000;
  auVar123._12_4_ = 0x3f800000;
  auVar123._16_4_ = 0x3f800000;
  auVar123._20_4_ = 0x3f800000;
  auVar123._24_4_ = 0x3f800000;
  auVar123._28_4_ = 0x3f800000;
  auVar4 = vfnmadd213ps_fma(auVar147,auVar14,auVar123);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar14,auVar14);
  auVar147 = vrcpps_avx(auVar15);
  auVar5 = vfnmadd213ps_fma(auVar15,auVar147,auVar123);
  auVar15 = vrcpps_avx(auVar96);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar147,auVar147);
  auVar189 = vfnmadd213ps_fma(auVar96,auVar15,auVar123);
  auVar189 = vfmadd132ps_fma(ZEXT1632(auVar189),auVar15,auVar15);
  auVar96 = vsubps_avx(ZEXT1632(auVar205),ZEXT1632(auVar139));
  auVar15._4_4_ = auVar96._4_4_ * auVar4._4_4_;
  auVar15._0_4_ = auVar96._0_4_ * auVar4._0_4_;
  auVar15._8_4_ = auVar96._8_4_ * auVar4._8_4_;
  auVar15._12_4_ = auVar96._12_4_ * auVar4._12_4_;
  auVar15._16_4_ = auVar96._16_4_ * 0.0;
  auVar15._20_4_ = auVar96._20_4_ * 0.0;
  auVar15._24_4_ = auVar96._24_4_ * 0.0;
  auVar15._28_4_ = auVar96._28_4_;
  auVar96 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar139));
  auVar14._4_4_ = auVar4._4_4_ * auVar96._4_4_;
  auVar14._0_4_ = auVar4._0_4_ * auVar96._0_4_;
  auVar14._8_4_ = auVar4._8_4_ * auVar96._8_4_;
  auVar14._12_4_ = auVar4._12_4_ * auVar96._12_4_;
  auVar14._16_4_ = auVar96._16_4_ * 0.0;
  auVar14._20_4_ = auVar96._20_4_ * 0.0;
  auVar14._24_4_ = auVar96._24_4_ * 0.0;
  auVar14._28_4_ = auVar96._28_4_;
  auVar96 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar249));
  auVar98._4_4_ = auVar5._4_4_ * auVar96._4_4_;
  auVar98._0_4_ = auVar5._0_4_ * auVar96._0_4_;
  auVar98._8_4_ = auVar5._8_4_ * auVar96._8_4_;
  auVar98._12_4_ = auVar5._12_4_ * auVar96._12_4_;
  auVar98._16_4_ = auVar96._16_4_ * 0.0;
  auVar98._20_4_ = auVar96._20_4_ * 0.0;
  auVar98._24_4_ = auVar96._24_4_ * 0.0;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96 = vsubps_avx(ZEXT1632(auVar238),ZEXT1632(auVar249));
  auVar145._4_4_ = auVar5._4_4_ * auVar96._4_4_;
  auVar145._0_4_ = auVar5._0_4_ * auVar96._0_4_;
  auVar145._8_4_ = auVar5._8_4_ * auVar96._8_4_;
  auVar145._12_4_ = auVar5._12_4_ * auVar96._12_4_;
  auVar145._16_4_ = auVar96._16_4_ * 0.0;
  auVar145._20_4_ = auVar96._20_4_ * 0.0;
  auVar145._24_4_ = auVar96._24_4_ * 0.0;
  auVar145._28_4_ = 0x3f800000;
  auVar96 = vsubps_avx(ZEXT1632(auVar142),ZEXT1632(auVar84));
  auVar199._4_4_ = auVar189._4_4_ * auVar96._4_4_;
  auVar199._0_4_ = auVar189._0_4_ * auVar96._0_4_;
  auVar199._8_4_ = auVar189._8_4_ * auVar96._8_4_;
  auVar199._12_4_ = auVar189._12_4_ * auVar96._12_4_;
  auVar199._16_4_ = auVar96._16_4_ * 0.0;
  auVar199._20_4_ = auVar96._20_4_ * 0.0;
  auVar199._24_4_ = auVar96._24_4_ * 0.0;
  auVar199._28_4_ = auVar96._28_4_;
  auVar96 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar84));
  auVar95._0_4_ = auVar189._0_4_ * auVar96._0_4_;
  auVar95._4_4_ = auVar189._4_4_ * auVar96._4_4_;
  auVar95._8_4_ = auVar189._8_4_ * auVar96._8_4_;
  auVar95._12_4_ = auVar189._12_4_ * auVar96._12_4_;
  auVar95._16_4_ = auVar96._16_4_ * 0.0;
  auVar95._20_4_ = auVar96._20_4_ * 0.0;
  auVar95._24_4_ = auVar96._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar15,auVar14);
  auVar147 = vpminsd_avx2(auVar98,auVar145);
  auVar96 = vmaxps_avx(auVar96,auVar147);
  auVar147 = vpminsd_avx2(auVar199,auVar95);
  uVar80 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar234._4_4_ = uVar80;
  auVar234._0_4_ = uVar80;
  auVar234._8_4_ = uVar80;
  auVar234._12_4_ = uVar80;
  auVar234._16_4_ = uVar80;
  auVar234._20_4_ = uVar80;
  auVar234._24_4_ = uVar80;
  auVar234._28_4_ = uVar80;
  auVar147 = vmaxps_avx(auVar147,auVar234);
  auVar96 = vmaxps_avx(auVar96,auVar147);
  local_420._4_4_ = auVar96._4_4_ * 0.99999964;
  local_420._0_4_ = auVar96._0_4_ * 0.99999964;
  local_420._8_4_ = auVar96._8_4_ * 0.99999964;
  local_420._12_4_ = auVar96._12_4_ * 0.99999964;
  local_420._16_4_ = auVar96._16_4_ * 0.99999964;
  local_420._20_4_ = auVar96._20_4_ * 0.99999964;
  local_420._24_4_ = auVar96._24_4_ * 0.99999964;
  local_420._28_4_ = 0x3f7ffffa;
  auVar96 = vpmaxsd_avx2(auVar15,auVar14);
  auVar147 = vpmaxsd_avx2(auVar98,auVar145);
  auVar96 = vminps_avx(auVar96,auVar147);
  fVar248 = (ray->super_RayK<1>).tfar;
  auVar144._4_4_ = fVar248;
  auVar144._0_4_ = fVar248;
  auVar144._8_4_ = fVar248;
  auVar144._12_4_ = fVar248;
  auVar144._16_4_ = fVar248;
  auVar144._20_4_ = fVar248;
  auVar144._24_4_ = fVar248;
  auVar144._28_4_ = fVar248;
  auVar147 = vpmaxsd_avx2(auVar199,auVar95);
  auVar147 = vminps_avx(auVar147,auVar144);
  auVar96 = vminps_avx(auVar96,auVar147);
  auVar225._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar225._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar225._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar225._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar225._16_4_ = auVar96._16_4_ * 1.0000004;
  auVar225._20_4_ = auVar96._20_4_ * 1.0000004;
  auVar225._24_4_ = auVar96._24_4_ * 1.0000004;
  auVar225._28_4_ = auVar96._28_4_;
  auVar124[4] = PVar7;
  auVar124._5_3_ = 0;
  auVar124[8] = PVar7;
  auVar124._9_3_ = 0;
  auVar124[0xc] = PVar7;
  auVar124._13_3_ = 0;
  auVar124[0x10] = PVar7;
  auVar124._17_3_ = 0;
  auVar124[0x14] = PVar7;
  auVar124._21_3_ = 0;
  auVar124[0x18] = PVar7;
  auVar124._25_3_ = 0;
  auVar124[0x1c] = PVar7;
  auVar124._29_3_ = 0;
  auVar96 = vcmpps_avx(local_420,auVar225,2);
  auVar147 = vpcmpgtd_avx2(auVar124,_DAT_01fb4ba0);
  auVar96 = vandps_avx(auVar96,auVar147);
  uVar80 = vmovmskps_avx(auVar96);
  uVar75 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar80);
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  auVar247 = ZEXT3264(_DAT_01f7b040);
LAB_013c6153:
  if (uVar75 == 0) {
    return;
  }
  lVar82 = 0;
  for (uVar78 = uVar75; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar81 = *(uint *)(local_7e8 + 2);
  pGVar8 = (context->scene->geometries).items[uVar81].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_7e8 + lVar82 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar248 = (pGVar8->time_range).lower;
  fVar248 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar248) /
            ((pGVar8->time_range).upper - fVar248));
  auVar4 = vroundss_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),9);
  auVar4 = vminss_avx(auVar4,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar4 = vmaxss_avx(ZEXT816(0) << 0x20,auVar4);
  fVar248 = fVar248 - auVar4._0_4_;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar79 = (long)(int)auVar4._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar79);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar79);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar79);
  pfVar1 = (float *)(lVar11 + uVar78 * lVar12);
  auVar109._0_4_ = fVar248 * *pfVar1;
  auVar109._4_4_ = fVar248 * pfVar1[1];
  auVar109._8_4_ = fVar248 * pfVar1[2];
  auVar109._12_4_ = fVar248 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar78 + 1) * lVar12);
  auVar137._0_4_ = fVar248 * *pfVar1;
  auVar137._4_4_ = fVar248 * pfVar1[1];
  auVar137._8_4_ = fVar248 * pfVar1[2];
  auVar137._12_4_ = fVar248 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar78 + 2) * lVar12);
  auVar187._0_4_ = fVar248 * *pfVar1;
  auVar187._4_4_ = fVar248 * pfVar1[1];
  auVar187._8_4_ = fVar248 * pfVar1[2];
  auVar187._12_4_ = fVar248 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar78 + 3));
  auVar159._0_4_ = fVar248 * *pfVar1;
  auVar159._4_4_ = fVar248 * pfVar1[1];
  auVar159._8_4_ = fVar248 * pfVar1[2];
  auVar159._12_4_ = fVar248 * pfVar1[3];
  lVar11 = *(long *)(_Var9 + lVar79);
  fVar248 = 1.0 - fVar248;
  auVar84._4_4_ = fVar248;
  auVar84._0_4_ = fVar248;
  auVar84._8_4_ = fVar248;
  auVar84._12_4_ = fVar248;
  auVar205 = vfmadd231ps_fma(auVar109,auVar84,*(undefined1 (*) [16])(lVar11 + lVar10 * uVar78));
  auVar88 = vfmadd231ps_fma(auVar137,auVar84,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar78 + 1)))
  ;
  auVar213 = vfmadd231ps_fma(auVar187,auVar84,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar78 + 2))
                            );
  auVar238 = vfmadd231ps_fma(auVar159,auVar84,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar78 + 3))
                            );
  auVar202._0_4_ = (auVar205._0_4_ + auVar88._0_4_ + auVar213._0_4_ + auVar238._0_4_) * 0.25;
  auVar202._4_4_ = (auVar205._4_4_ + auVar88._4_4_ + auVar213._4_4_ + auVar238._4_4_) * 0.25;
  auVar202._8_4_ = (auVar205._8_4_ + auVar88._8_4_ + auVar213._8_4_ + auVar238._8_4_) * 0.25;
  auVar202._12_4_ = (auVar205._12_4_ + auVar88._12_4_ + auVar213._12_4_ + auVar238._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar4 = vsubps_avx(auVar202,(undefined1  [16])aVar2);
  auVar4 = vdpps_avx(auVar4,(undefined1  [16])aVar3,0x7f);
  auVar5 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar189 = vrcpss_avx(auVar5,auVar5);
  auVar5 = vfnmadd213ss_fma(auVar189,auVar5,ZEXT416(0x40000000));
  fVar248 = auVar4._0_4_ * auVar189._0_4_ * auVar5._0_4_;
  local_800 = ZEXT416((uint)fVar248);
  auVar203._4_4_ = fVar248;
  auVar203._0_4_ = fVar248;
  auVar203._8_4_ = fVar248;
  auVar203._12_4_ = fVar248;
  fStack_870 = fVar248;
  _local_880 = auVar203;
  fStack_86c = fVar248;
  fStack_868 = fVar248;
  fStack_864 = fVar248;
  auVar4 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar203);
  auVar4 = vblendps_avx(auVar4,_DAT_01f45a50,8);
  auVar189 = vsubps_avx(auVar205,auVar4);
  auVar205 = vsubps_avx(auVar213,auVar4);
  local_a90 = vsubps_avx(auVar88,auVar4);
  _local_aa0 = vsubps_avx(auVar238,auVar4);
  auVar4 = vmovshdup_avx(auVar189);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar189,auVar189,0xaa);
  uVar108 = auVar4._0_8_;
  auVar224._8_8_ = uVar108;
  auVar224._0_8_ = uVar108;
  auVar224._16_8_ = uVar108;
  auVar224._24_8_ = uVar108;
  auVar4 = vshufps_avx(auVar189,auVar189,0xff);
  uVar108 = auVar4._0_8_;
  auVar235._8_8_ = uVar108;
  auVar235._0_8_ = uVar108;
  auVar235._16_8_ = uVar108;
  auVar235._24_8_ = uVar108;
  auVar4 = vmovshdup_avx(local_a90);
  uVar108 = auVar4._0_8_;
  auVar269._8_8_ = uVar108;
  auVar269._0_8_ = uVar108;
  auVar269._16_8_ = uVar108;
  auVar269._24_8_ = uVar108;
  auVar4 = vshufps_avx(local_a90,local_a90,0xaa);
  uVar108 = auVar4._0_8_;
  local_3c0._8_8_ = uVar108;
  local_3c0._0_8_ = uVar108;
  local_3c0._16_8_ = uVar108;
  local_3c0._24_8_ = uVar108;
  auVar4 = vshufps_avx(local_a90,local_a90,0xff);
  uVar108 = auVar4._0_8_;
  local_900._8_8_ = uVar108;
  local_900._0_8_ = uVar108;
  local_900._16_8_ = uVar108;
  local_900._24_8_ = uVar108;
  auVar4 = vmovshdup_avx(auVar205);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar205,auVar205,0xaa);
  uVar108 = auVar5._0_8_;
  auVar271._8_8_ = uVar108;
  auVar271._0_8_ = uVar108;
  auVar271._16_8_ = uVar108;
  auVar271._24_8_ = uVar108;
  auVar4 = vshufps_avx(auVar205,auVar205,0xff);
  local_4e0 = auVar4._0_4_;
  fStack_4dc = auVar4._4_4_;
  auVar4 = vmovshdup_avx(_local_aa0);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  local_260 = auVar4._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar85._0_4_ = aVar3.x * aVar3.x;
  auVar85._4_4_ = aVar3.y * aVar3.y;
  auVar85._8_4_ = aVar3.z * aVar3.z;
  auVar85._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar4 = vshufps_avx(auVar85,auVar85,0xaa);
  auVar97._0_8_ = auVar4._0_8_;
  auVar97._8_8_ = auVar97._0_8_;
  auVar97._16_8_ = auVar97._0_8_;
  auVar97._24_8_ = auVar97._0_8_;
  uVar80 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_5c0._4_4_ = uVar80;
  local_5c0._0_4_ = uVar80;
  fStack_5b8 = (float)uVar80;
  fStack_5b4 = (float)uVar80;
  fStack_5b0 = (float)uVar80;
  fStack_5ac = (float)uVar80;
  fStack_5a8 = (float)uVar80;
  register0x0000125c = uVar80;
  uVar80 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_5e0._4_4_ = uVar80;
  local_5e0._0_4_ = uVar80;
  fStack_5d8 = (float)uVar80;
  fStack_5d4 = (float)uVar80;
  fStack_5d0 = (float)uVar80;
  fStack_5cc = (float)uVar80;
  fStack_5c8 = (float)uVar80;
  register0x0000135c = uVar80;
  auVar4 = vfmadd231ps_fma(auVar97,_local_5e0,_local_5e0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5c0,_local_5c0);
  uVar77 = 0;
  local_b6c = 1;
  local_600 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  local_840._0_16_ = auVar189;
  uVar80 = auVar189._0_4_;
  local_3e0._4_4_ = uVar80;
  local_3e0._0_4_ = uVar80;
  local_3e0._8_4_ = uVar80;
  local_3e0._12_4_ = uVar80;
  local_3e0._16_4_ = uVar80;
  local_3e0._20_4_ = uVar80;
  local_3e0._24_4_ = uVar80;
  local_3e0._28_4_ = uVar80;
  auVar222 = ZEXT3264(local_900);
  uVar80 = local_a90._0_4_;
  local_960._4_4_ = uVar80;
  local_960._0_4_ = uVar80;
  local_960._8_4_ = uVar80;
  local_960._12_4_ = uVar80;
  local_960._16_4_ = uVar80;
  local_960._20_4_ = uVar80;
  local_960._24_4_ = uVar80;
  local_960._28_4_ = uVar80;
  auVar242 = ZEXT3264(local_960);
  local_860._0_16_ = auVar205;
  local_400._0_4_ = auVar205._0_4_;
  local_400._4_4_ = local_400._0_4_;
  local_400._8_4_ = local_400._0_4_;
  local_400._12_4_ = local_400._0_4_;
  local_400._16_4_ = local_400._0_4_;
  local_400._20_4_ = local_400._0_4_;
  local_400._24_4_ = local_400._0_4_;
  local_400._28_4_ = local_400._0_4_;
  local_2a0 = local_aa0._0_4_;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_280 = ZEXT1632(auVar4);
  local_500 = vandps_avx(ZEXT1632(auVar4),local_6c0);
  local_590 = ZEXT816(0x3f80000000000000);
  local_3a0 = auVar224;
  local_920 = auVar235;
  local_940 = auVar269;
  uVar78 = (ulong)*(uint *)(local_7e8 + lVar82 * 4 + 6);
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  do {
    auVar174._8_4_ = 0x3f800000;
    auVar174._0_8_ = 0x3f8000003f800000;
    auVar174._12_4_ = 0x3f800000;
    auVar174._16_4_ = 0x3f800000;
    auVar174._20_4_ = 0x3f800000;
    auVar174._24_4_ = 0x3f800000;
    auVar174._28_4_ = 0x3f800000;
    auVar4 = vmovshdup_avx(local_590);
    auVar4 = vsubps_avx(auVar4,local_590);
    fVar257 = auVar4._0_4_;
    fVar158 = fVar257 * 0.04761905;
    local_720._0_4_ = local_590._0_4_;
    local_720._4_4_ = local_720._0_4_;
    local_720._8_4_ = local_720._0_4_;
    local_720._12_4_ = local_720._0_4_;
    local_720._16_4_ = local_720._0_4_;
    local_720._20_4_ = local_720._0_4_;
    local_720._24_4_ = local_720._0_4_;
    local_720._28_4_ = local_720._0_4_;
    local_740._4_4_ = fVar257;
    local_740._0_4_ = fVar257;
    local_740._8_4_ = fVar257;
    local_740._12_4_ = fVar257;
    local_740._16_4_ = fVar257;
    local_740._20_4_ = fVar257;
    local_740._24_4_ = fVar257;
    local_740._28_4_ = fVar257;
    auVar4 = vfmadd231ps_fma(local_720,local_740,auVar247._0_32_);
    auVar96 = vsubps_avx(auVar174,ZEXT1632(auVar4));
    fVar248 = auVar4._0_4_;
    auVar232._0_4_ = auVar242._0_4_ * fVar248;
    fVar136 = auVar4._4_4_;
    auVar232._4_4_ = auVar242._4_4_ * fVar136;
    fVar256 = auVar4._8_4_;
    auVar232._8_4_ = auVar242._8_4_ * fVar256;
    fVar153 = auVar4._12_4_;
    auVar232._12_4_ = auVar242._12_4_ * fVar153;
    auVar232._16_4_ = auVar242._16_4_ * 0.0;
    auVar232._20_4_ = auVar242._20_4_ * 0.0;
    auVar232._28_36_ = auVar255._28_36_;
    auVar232._24_4_ = auVar242._24_4_ * 0.0;
    auVar282._0_4_ = auVar269._0_4_ * fVar248;
    auVar282._4_4_ = auVar269._4_4_ * fVar136;
    auVar282._8_4_ = auVar269._8_4_ * fVar256;
    auVar282._12_4_ = auVar269._12_4_ * fVar153;
    auVar282._16_4_ = auVar269._16_4_ * 0.0;
    auVar282._20_4_ = auVar269._20_4_ * 0.0;
    auVar282._28_36_ = auVar247._28_36_;
    auVar282._24_4_ = auVar269._24_4_ * 0.0;
    auVar19._4_4_ = local_3c0._4_4_ * fVar136;
    auVar19._0_4_ = local_3c0._0_4_ * fVar248;
    auVar19._8_4_ = local_3c0._8_4_ * fVar256;
    auVar19._12_4_ = local_3c0._12_4_ * fVar153;
    auVar19._16_4_ = local_3c0._16_4_ * 0.0;
    auVar19._20_4_ = local_3c0._20_4_ * 0.0;
    auVar19._24_4_ = local_3c0._24_4_ * 0.0;
    auVar19._28_4_ = 0x3f800000;
    auVar20._4_4_ = auVar222._4_4_ * fVar136;
    auVar20._0_4_ = auVar222._0_4_ * fVar248;
    auVar20._8_4_ = auVar222._8_4_ * fVar256;
    auVar20._12_4_ = auVar222._12_4_ * fVar153;
    auVar20._16_4_ = auVar222._16_4_ * 0.0;
    auVar20._20_4_ = auVar222._20_4_ * 0.0;
    auVar20._24_4_ = auVar222._24_4_ * 0.0;
    auVar20._28_4_ = fVar257;
    auVar4 = vfmadd231ps_fma(auVar232._0_32_,auVar96,local_3e0);
    auVar69._8_8_ = uStack_1d8;
    auVar69._0_8_ = local_1e0;
    auVar69._16_8_ = uStack_1d0;
    auVar69._24_8_ = uStack_1c8;
    auVar189 = vfmadd231ps_fma(auVar282._0_32_,auVar96,auVar69);
    auVar205 = vfmadd231ps_fma(auVar19,auVar96,auVar224);
    auVar88 = vfmadd231ps_fma(auVar20,auVar96,auVar235);
    auVar70._4_4_ = local_400._4_4_ * fVar136;
    auVar70._0_4_ = local_400._0_4_ * fVar248;
    auVar70._8_4_ = local_400._8_4_ * fVar256;
    auVar70._12_4_ = local_400._12_4_ * fVar153;
    auVar70._16_4_ = local_400._16_4_ * 0.0;
    auVar70._20_4_ = local_400._20_4_ * 0.0;
    auVar70._24_4_ = local_400._24_4_ * 0.0;
    auVar70._28_4_ = auVar235._28_4_;
    auVar68._8_8_ = uStack_1f8;
    auVar68._0_8_ = local_200;
    auVar68._16_8_ = uStack_1f0;
    auVar68._24_8_ = uStack_1e8;
    auVar21._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar136;
    auVar21._0_4_ = (float)local_200 * fVar248;
    auVar21._8_4_ = (float)uStack_1f8 * fVar256;
    auVar21._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar153;
    auVar21._16_4_ = (float)uStack_1f0 * 0.0;
    auVar21._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar21._24_4_ = (float)uStack_1e8 * 0.0;
    auVar21._28_4_ = local_3e0._28_4_;
    fVar257 = auVar5._0_4_;
    fVar258 = auVar5._4_4_;
    auVar22._4_4_ = fVar258 * fVar136;
    auVar22._0_4_ = fVar257 * fVar248;
    auVar22._8_4_ = fVar257 * fVar256;
    auVar22._12_4_ = fVar258 * fVar153;
    auVar22._16_4_ = fVar257 * 0.0;
    auVar22._20_4_ = fVar258 * 0.0;
    auVar22._24_4_ = fVar257 * 0.0;
    auVar22._28_4_ = local_400._28_4_;
    auVar175._0_4_ = fVar248 * local_4e0;
    auVar175._4_4_ = fVar136 * fStack_4dc;
    auVar175._8_4_ = fVar256 * fStack_4d8;
    auVar175._12_4_ = fVar153 * fStack_4d4;
    auVar175._16_4_ = fStack_4d0 * 0.0;
    auVar175._20_4_ = fStack_4cc * 0.0;
    auVar175._24_4_ = fStack_4c8 * 0.0;
    auVar175._28_4_ = 0;
    auVar213 = vfmadd231ps_fma(auVar70,auVar96,auVar242._0_32_);
    auVar238 = vfmadd231ps_fma(auVar21,auVar96,auVar269);
    auVar142 = vfmadd231ps_fma(auVar22,auVar96,local_3c0);
    auVar6 = vfmadd231ps_fma(auVar175,auVar96,auVar222._0_32_);
    auVar71._4_4_ = fVar136 * fStack_29c;
    auVar71._0_4_ = fVar248 * local_2a0;
    auVar71._8_4_ = fVar256 * fStack_298;
    auVar71._12_4_ = fVar153 * fStack_294;
    auVar71._16_4_ = fStack_290 * 0.0;
    auVar71._20_4_ = fStack_28c * 0.0;
    auVar71._24_4_ = fStack_288 * 0.0;
    auVar71._28_4_ = auVar269._28_4_;
    auVar23._4_4_ = fVar136 * local_220._4_4_;
    auVar23._0_4_ = fVar248 * (float)local_220;
    auVar23._8_4_ = fVar256 * (float)uStack_218;
    auVar23._12_4_ = fVar153 * uStack_218._4_4_;
    auVar23._16_4_ = (float)uStack_210 * 0.0;
    auVar23._20_4_ = uStack_210._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_208 * 0.0;
    auVar23._28_4_ = local_3c0._28_4_;
    auVar247._28_36_ = auVar222._28_36_;
    auVar247._0_28_ =
         ZEXT1628(CONCAT412(auVar213._12_4_ * fVar153,
                            CONCAT48(auVar213._8_4_ * fVar256,
                                     CONCAT44(auVar213._4_4_ * fVar136,auVar213._0_4_ * fVar248))));
    auVar4 = vfmadd231ps_fma(auVar247._0_32_,auVar96,ZEXT1632(auVar4));
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar238._12_4_,
                                                  CONCAT48(fVar256 * auVar238._8_4_,
                                                           CONCAT44(fVar136 * auVar238._4_4_,
                                                                    fVar248 * auVar238._0_4_)))),
                               auVar96,ZEXT1632(auVar189));
    auVar205 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar142._12_4_,
                                                  CONCAT48(fVar256 * auVar142._8_4_,
                                                           CONCAT44(fVar136 * auVar142._4_4_,
                                                                    fVar248 * auVar142._0_4_)))),
                               auVar96,ZEXT1632(auVar205));
    auVar255._28_36_ = auVar242._28_36_;
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(fVar153 * auVar6._12_4_,
                            CONCAT48(fVar256 * auVar6._8_4_,
                                     CONCAT44(fVar136 * auVar6._4_4_,fVar248 * auVar6._0_4_))));
    auVar88 = vfmadd231ps_fma(auVar255._0_32_,auVar96,ZEXT1632(auVar88));
    auVar24._4_4_ = fVar136 * local_240._4_4_;
    auVar24._0_4_ = fVar248 * (float)local_240;
    auVar24._8_4_ = fVar256 * (float)uStack_238;
    auVar24._12_4_ = fVar153 * uStack_238._4_4_;
    auVar24._16_4_ = (float)uStack_230 * 0.0;
    auVar24._20_4_ = uStack_230._4_4_ * 0.0;
    auVar24._24_4_ = (float)uStack_228 * 0.0;
    auVar24._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar71,auVar96,local_400);
    auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar139._12_4_ * fVar153,
                                                  CONCAT48(auVar139._8_4_ * fVar256,
                                                           CONCAT44(auVar139._4_4_ * fVar136,
                                                                    auVar139._0_4_ * fVar248)))),
                               auVar96,ZEXT1632(auVar213));
    auVar236._0_4_ = fVar248 * (float)local_260;
    auVar236._4_4_ = fVar136 * local_260._4_4_;
    auVar236._8_4_ = fVar256 * (float)uStack_258;
    auVar236._12_4_ = fVar153 * uStack_258._4_4_;
    auVar236._16_4_ = (float)uStack_250 * 0.0;
    auVar236._20_4_ = uStack_250._4_4_ * 0.0;
    auVar236._24_4_ = (float)uStack_248 * 0.0;
    auVar236._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar23,auVar96,auVar68);
    auVar249 = vfmadd231ps_fma(auVar24,auVar96,auVar271);
    auVar65._4_4_ = fStack_4dc;
    auVar65._0_4_ = local_4e0;
    auVar65._8_4_ = fStack_4d8;
    auVar65._12_4_ = fStack_4d4;
    auVar65._16_4_ = fStack_4d0;
    auVar65._20_4_ = fStack_4cc;
    auVar65._24_4_ = fStack_4c8;
    auVar65._28_4_ = fStack_4c4;
    auVar84 = vfmadd231ps_fma(auVar236,auVar96,auVar65);
    auVar72._28_4_ = fVar258;
    auVar72._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar153,
                            CONCAT48(auVar84._8_4_ * fVar256,
                                     CONCAT44(auVar84._4_4_ * fVar136,auVar84._0_4_ * fVar248))));
    auVar238 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar139._12_4_ * fVar153,
                                                  CONCAT48(auVar139._8_4_ * fVar256,
                                                           CONCAT44(auVar139._4_4_ * fVar136,
                                                                    auVar139._0_4_ * fVar248)))),
                               auVar96,ZEXT1632(auVar238));
    auVar142 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar153 * auVar249._12_4_,
                                                  CONCAT48(fVar256 * auVar249._8_4_,
                                                           CONCAT44(fVar136 * auVar249._4_4_,
                                                                    fVar248 * auVar249._0_4_)))),
                               auVar96,ZEXT1632(auVar142));
    auVar6 = vfmadd231ps_fma(auVar72,auVar96,ZEXT1632(auVar6));
    auVar25._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar153 * auVar142._12_4_,
                            CONCAT48(fVar256 * auVar142._8_4_,
                                     CONCAT44(fVar136 * auVar142._4_4_,fVar248 * auVar142._0_4_))));
    auVar26._28_4_ = local_400._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar6._12_4_ * fVar153,
                            CONCAT48(auVar6._8_4_ * fVar256,
                                     CONCAT44(auVar6._4_4_ * fVar136,auVar6._0_4_ * fVar248))));
    auVar139 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar213._12_4_ * fVar153,
                                                  CONCAT48(auVar213._8_4_ * fVar256,
                                                           CONCAT44(auVar213._4_4_ * fVar136,
                                                                    auVar213._0_4_ * fVar248)))),
                               auVar96,ZEXT1632(auVar4));
    auVar249 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar238._12_4_ * fVar153,
                                                  CONCAT48(auVar238._8_4_ * fVar256,
                                                           CONCAT44(auVar238._4_4_ * fVar136,
                                                                    auVar238._0_4_ * fVar248)))),
                               auVar96,ZEXT1632(auVar189));
    auVar84 = vfmadd231ps_fma(auVar25,auVar96,ZEXT1632(auVar205));
    auVar85 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar88),auVar96);
    auVar16 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar4));
    auVar147 = vsubps_avx(ZEXT1632(auVar238),ZEXT1632(auVar189));
    auVar96 = vsubps_avx(ZEXT1632(auVar142),ZEXT1632(auVar205));
    auVar15 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar88));
    local_a20._0_4_ = fVar158 * auVar16._0_4_ * 3.0;
    local_a20._4_4_ = fVar158 * auVar16._4_4_ * 3.0;
    local_a20._8_4_ = fVar158 * auVar16._8_4_ * 3.0;
    local_a20._12_4_ = fVar158 * auVar16._12_4_ * 3.0;
    local_a20._16_4_ = fVar158 * auVar16._16_4_ * 3.0;
    local_a20._20_4_ = fVar158 * auVar16._20_4_ * 3.0;
    local_a20._24_4_ = fVar158 * auVar16._24_4_ * 3.0;
    local_a20._28_4_ = 0;
    local_700._0_4_ = fVar158 * auVar147._0_4_ * 3.0;
    local_700._4_4_ = fVar158 * auVar147._4_4_ * 3.0;
    local_700._8_4_ = fVar158 * auVar147._8_4_ * 3.0;
    local_700._12_4_ = fVar158 * auVar147._12_4_ * 3.0;
    local_700._16_4_ = fVar158 * auVar147._16_4_ * 3.0;
    local_700._20_4_ = fVar158 * auVar147._20_4_ * 3.0;
    local_700._24_4_ = fVar158 * auVar147._24_4_ * 3.0;
    local_700._28_4_ = 0;
    fVar107 = fVar158 * auVar96._0_4_ * 3.0;
    fVar130 = fVar158 * auVar96._4_4_ * 3.0;
    local_a40._4_4_ = fVar130;
    local_a40._0_4_ = fVar107;
    fVar131 = fVar158 * auVar96._8_4_ * 3.0;
    local_a40._8_4_ = fVar131;
    fVar132 = fVar158 * auVar96._12_4_ * 3.0;
    local_a40._12_4_ = fVar132;
    fVar133 = fVar158 * auVar96._16_4_ * 3.0;
    local_a40._16_4_ = fVar133;
    fVar134 = fVar158 * auVar96._20_4_ * 3.0;
    local_a40._20_4_ = fVar134;
    fVar135 = fVar158 * auVar96._24_4_ * 3.0;
    local_a40._24_4_ = fVar135;
    local_a40._28_4_ = auVar16._28_4_;
    fVar136 = fVar158 * auVar15._0_4_ * 3.0;
    fVar153 = fVar158 * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fVar153;
    auVar27._0_4_ = fVar136;
    fVar154 = fVar158 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fVar154;
    fVar155 = fVar158 * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fVar155;
    fVar156 = fVar158 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = fVar156;
    fVar157 = fVar158 * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fVar157;
    fVar158 = fVar158 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fVar158;
    auVar27._28_4_ = auVar147._28_4_;
    auVar176 = ZEXT1632(auVar139);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar139));
    local_8c0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar249));
    _local_820 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar84));
    local_2e0 = vsubps_avx(local_9a0,auVar176);
    local_2c0 = vsubps_avx(_local_820,ZEXT1632(auVar84));
    fVar248 = local_2c0._0_4_;
    fVar256 = local_2c0._4_4_;
    auVar28._4_4_ = local_a20._4_4_ * fVar256;
    auVar28._0_4_ = local_a20._0_4_ * fVar248;
    fVar257 = local_2c0._8_4_;
    auVar28._8_4_ = local_a20._8_4_ * fVar257;
    fVar258 = local_2c0._12_4_;
    auVar28._12_4_ = local_a20._12_4_ * fVar258;
    fVar259 = local_2c0._16_4_;
    auVar28._16_4_ = local_a20._16_4_ * fVar259;
    fVar260 = local_2c0._20_4_;
    auVar28._20_4_ = local_a20._20_4_ * fVar260;
    fVar261 = local_2c0._24_4_;
    auVar28._24_4_ = local_a20._24_4_ * fVar261;
    auVar28._28_4_ = local_9a0._28_4_;
    auVar4 = vfmsub231ps_fma(auVar28,local_a40,local_2e0);
    local_300 = vsubps_avx(local_8c0,ZEXT1632(auVar249));
    fVar267 = local_2e0._0_4_;
    fVar268 = local_2e0._4_4_;
    auVar29._4_4_ = fVar268 * local_700._4_4_;
    auVar29._0_4_ = fVar267 * local_700._0_4_;
    fVar275 = local_2e0._8_4_;
    auVar29._8_4_ = fVar275 * local_700._8_4_;
    fVar276 = local_2e0._12_4_;
    auVar29._12_4_ = fVar276 * local_700._12_4_;
    fVar277 = local_2e0._16_4_;
    auVar29._16_4_ = fVar277 * local_700._16_4_;
    fVar278 = local_2e0._20_4_;
    auVar29._20_4_ = fVar278 * local_700._20_4_;
    fVar279 = local_2e0._24_4_;
    auVar29._24_4_ = fVar279 * local_700._24_4_;
    auVar29._28_4_ = local_8c0._28_4_;
    auVar189 = vfmsub231ps_fma(auVar29,local_a20,local_300);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar189._12_4_ * auVar189._12_4_,
                                                CONCAT48(auVar189._8_4_ * auVar189._8_4_,
                                                         CONCAT44(auVar189._4_4_ * auVar189._4_4_,
                                                                  auVar189._0_4_ * auVar189._0_4_)))
                                     ),ZEXT1632(auVar4),ZEXT1632(auVar4));
    fVar183 = local_300._0_4_;
    auVar177._0_4_ = fVar183 * fVar107;
    fVar184 = local_300._4_4_;
    auVar177._4_4_ = fVar184 * fVar130;
    fVar185 = local_300._8_4_;
    auVar177._8_4_ = fVar185 * fVar131;
    fVar186 = local_300._12_4_;
    auVar177._12_4_ = fVar186 * fVar132;
    fVar262 = local_300._16_4_;
    auVar177._16_4_ = fVar262 * fVar133;
    fVar263 = local_300._20_4_;
    auVar177._20_4_ = fVar263 * fVar134;
    fVar266 = local_300._24_4_;
    auVar177._24_4_ = fVar266 * fVar135;
    auVar177._28_4_ = 0;
    auVar189 = vfmsub231ps_fma(auVar177,local_700,local_2c0);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar189),ZEXT1632(auVar189));
    auVar178._0_4_ = fVar248 * fVar248;
    auVar178._4_4_ = fVar256 * fVar256;
    auVar178._8_4_ = fVar257 * fVar257;
    auVar178._12_4_ = fVar258 * fVar258;
    auVar178._16_4_ = fVar259 * fVar259;
    auVar178._20_4_ = fVar260 * fVar260;
    auVar178._24_4_ = fVar261 * fVar261;
    auVar178._28_4_ = 0;
    auVar4 = vfmadd231ps_fma(auVar178,local_300,local_300);
    auVar205 = vfmadd231ps_fma(ZEXT1632(auVar4),local_2e0,local_2e0);
    auVar96 = vrcpps_avx(ZEXT1632(auVar205));
    auVar270._8_4_ = 0x3f800000;
    auVar270._0_8_ = 0x3f8000003f800000;
    auVar270._12_4_ = 0x3f800000;
    auVar270._16_4_ = 0x3f800000;
    auVar270._20_4_ = 0x3f800000;
    auVar270._24_4_ = 0x3f800000;
    auVar270._28_4_ = 0x3f800000;
    auVar4 = vfnmadd213ps_fma(auVar96,ZEXT1632(auVar205),auVar270);
    auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar96,auVar96);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,local_a20);
    local_8e0 = vpermps_avx2(_DAT_01fb7720,local_a40);
    auVar30._4_4_ = local_9c0._4_4_ * fVar256;
    auVar30._0_4_ = local_9c0._0_4_ * fVar248;
    auVar30._8_4_ = local_9c0._8_4_ * fVar257;
    auVar30._12_4_ = local_9c0._12_4_ * fVar258;
    auVar30._16_4_ = local_9c0._16_4_ * fVar259;
    auVar30._20_4_ = local_9c0._20_4_ * fVar260;
    auVar30._24_4_ = local_9c0._24_4_ * fVar261;
    auVar30._28_4_ = auVar96._28_4_;
    auVar88 = vfmsub231ps_fma(auVar30,local_8e0,local_2e0);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_700);
    auVar31._4_4_ = fVar268 * local_a60._4_4_;
    auVar31._0_4_ = fVar267 * local_a60._0_4_;
    auVar31._8_4_ = fVar275 * local_a60._8_4_;
    auVar31._12_4_ = fVar276 * local_a60._12_4_;
    auVar31._16_4_ = fVar277 * local_a60._16_4_;
    auVar31._20_4_ = fVar278 * local_a60._20_4_;
    auVar31._24_4_ = fVar279 * local_a60._24_4_;
    auVar31._28_4_ = 0;
    auVar213 = vfmsub231ps_fma(auVar31,local_9c0,local_300);
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar213._12_4_ * auVar213._12_4_,
                                                 CONCAT48(auVar213._8_4_ * auVar213._8_4_,
                                                          CONCAT44(auVar213._4_4_ * auVar213._4_4_,
                                                                   auVar213._0_4_ * auVar213._0_4_))
                                                )),ZEXT1632(auVar88),ZEXT1632(auVar88));
    auVar17 = local_8e0;
    auVar210._0_4_ = fVar183 * local_8e0._0_4_;
    auVar210._4_4_ = fVar184 * local_8e0._4_4_;
    auVar210._8_4_ = fVar185 * local_8e0._8_4_;
    auVar210._12_4_ = fVar186 * local_8e0._12_4_;
    auVar210._16_4_ = fVar262 * local_8e0._16_4_;
    auVar210._20_4_ = fVar263 * local_8e0._20_4_;
    auVar210._24_4_ = fVar266 * local_8e0._24_4_;
    auVar210._28_4_ = 0;
    auVar213 = vfmsub231ps_fma(auVar210,local_a60,local_2c0);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar213),ZEXT1632(auVar213));
    auVar96 = vmaxps_avx(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar189._12_4_,
                                            CONCAT48(auVar4._8_4_ * auVar189._8_4_,
                                                     CONCAT44(auVar4._4_4_ * auVar189._4_4_,
                                                              auVar4._0_4_ * auVar189._0_4_)))),
                         ZEXT1632(CONCAT412(auVar88._12_4_ * auVar4._12_4_,
                                            CONCAT48(auVar88._8_4_ * auVar4._8_4_,
                                                     CONCAT44(auVar88._4_4_ * auVar4._4_4_,
                                                              auVar88._0_4_ * auVar4._0_4_)))));
    local_780._0_4_ = auVar85._0_4_ + fVar136;
    local_780._4_4_ = auVar85._4_4_ + fVar153;
    local_780._8_4_ = auVar85._8_4_ + fVar154;
    local_780._12_4_ = auVar85._12_4_ + fVar155;
    local_780._16_4_ = fVar156 + 0.0;
    local_780._20_4_ = fVar157 + 0.0;
    local_780._24_4_ = fVar158 + 0.0;
    local_780._28_4_ = auVar147._28_4_ + 0.0;
    local_760 = ZEXT1632(auVar85);
    auVar147 = vsubps_avx(local_760,auVar27);
    _local_7a0 = vpermps_avx2(_DAT_01fb7720,auVar147);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,local_760);
    auVar147 = vmaxps_avx(local_760,local_780);
    auVar15 = vmaxps_avx(_local_7a0,local_7c0);
    auVar147 = vmaxps_avx(auVar147,auVar15);
    auVar15 = vrsqrtps_avx(ZEXT1632(auVar205));
    fVar136 = auVar15._0_4_;
    fVar153 = auVar15._4_4_;
    fVar158 = auVar15._8_4_;
    fVar154 = auVar15._12_4_;
    fVar155 = auVar15._16_4_;
    fVar156 = auVar15._20_4_;
    fVar157 = auVar15._24_4_;
    auVar239._0_4_ = fVar136 * fVar136 * fVar136 * auVar205._0_4_ * -0.5;
    auVar239._4_4_ = fVar153 * fVar153 * fVar153 * auVar205._4_4_ * -0.5;
    auVar239._8_4_ = fVar158 * fVar158 * fVar158 * auVar205._8_4_ * -0.5;
    auVar239._12_4_ = fVar154 * fVar154 * fVar154 * auVar205._12_4_ * -0.5;
    auVar239._16_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar239._20_4_ = fVar156 * fVar156 * fVar156 * -0.0;
    auVar239._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
    auVar239._28_4_ = 0;
    auVar179._8_4_ = 0x3fc00000;
    auVar179._0_8_ = 0x3fc000003fc00000;
    auVar179._12_4_ = 0x3fc00000;
    auVar179._16_4_ = 0x3fc00000;
    auVar179._20_4_ = 0x3fc00000;
    auVar179._24_4_ = 0x3fc00000;
    auVar179._28_4_ = 0x3fc00000;
    auVar4 = vfmadd231ps_fma(auVar239,auVar179,auVar15);
    fVar136 = auVar4._0_4_;
    fVar153 = auVar4._4_4_;
    auVar32._4_4_ = fVar184 * fVar153;
    auVar32._0_4_ = fVar183 * fVar136;
    fVar158 = auVar4._8_4_;
    auVar32._8_4_ = fVar185 * fVar158;
    fVar154 = auVar4._12_4_;
    auVar32._12_4_ = fVar186 * fVar154;
    auVar32._16_4_ = fVar262 * 0.0;
    auVar32._20_4_ = fVar263 * 0.0;
    auVar32._24_4_ = fVar266 * 0.0;
    auVar32._28_4_ = auVar15._28_4_;
    auVar33._4_4_ = fStack_5fc * fVar153 * fVar256;
    auVar33._0_4_ = local_600 * fVar136 * fVar248;
    auVar33._8_4_ = fStack_5f8 * fVar158 * fVar257;
    auVar33._12_4_ = fStack_5f4 * fVar154 * fVar258;
    auVar33._16_4_ = fStack_5f0 * fVar259 * 0.0;
    auVar33._20_4_ = fStack_5ec * fVar260 * 0.0;
    auVar33._24_4_ = fStack_5e8 * fVar261 * 0.0;
    auVar33._28_4_ = local_300._28_4_;
    auVar189 = vfmadd231ps_fma(auVar33,auVar32,_local_5e0);
    local_660 = ZEXT1632(auVar84);
    auVar15 = vsubps_avx(ZEXT832(0) << 0x20,local_660);
    fVar155 = auVar15._0_4_;
    auVar244._0_4_ = fVar155 * fVar136 * fVar248;
    fVar156 = auVar15._4_4_;
    auVar244._4_4_ = fVar156 * fVar153 * fVar256;
    fVar157 = auVar15._8_4_;
    auVar244._8_4_ = fVar157 * fVar158 * fVar257;
    fVar183 = auVar15._12_4_;
    auVar244._12_4_ = fVar183 * fVar154 * fVar258;
    fVar184 = auVar15._16_4_;
    auVar244._16_4_ = fVar184 * fVar259 * 0.0;
    fVar185 = auVar15._20_4_;
    auVar244._20_4_ = fVar185 * fVar260 * 0.0;
    fVar186 = auVar15._24_4_;
    auVar244._24_4_ = fVar186 * fVar261 * 0.0;
    auVar244._28_4_ = 0;
    local_680 = ZEXT1632(auVar249);
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,local_680);
    auVar205 = vfmadd231ps_fma(auVar244,auVar14,auVar32);
    auVar34._4_4_ = fVar268 * fVar153;
    auVar34._0_4_ = fVar267 * fVar136;
    auVar34._8_4_ = fVar275 * fVar158;
    auVar34._12_4_ = fVar276 * fVar154;
    auVar34._16_4_ = fVar277 * 0.0;
    auVar34._20_4_ = fVar278 * 0.0;
    auVar34._24_4_ = fVar279 * 0.0;
    auVar34._28_4_ = local_7a0._28_4_;
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar34,_local_5c0);
    auVar225 = ZEXT832(0) << 0x20;
    auVar98 = vsubps_avx(auVar225,auVar176);
    auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),auVar98,auVar34);
    _local_7e0 = vsqrtps_avx(auVar96);
    auVar35._4_4_ = fStack_5fc * fVar156;
    auVar35._0_4_ = local_600 * fVar155;
    auVar35._8_4_ = fStack_5f8 * fVar157;
    auVar35._12_4_ = fStack_5f4 * fVar183;
    auVar35._16_4_ = fStack_5f0 * fVar184;
    auVar35._20_4_ = fStack_5ec * fVar185;
    auVar35._24_4_ = fStack_5e8 * fVar186;
    auVar35._28_4_ = local_7a0._28_4_;
    auVar88 = vfmadd231ps_fma(auVar35,_local_5e0,auVar14);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),_local_5c0,auVar98);
    fVar248 = auVar205._0_4_;
    fVar263 = auVar189._0_4_;
    fVar256 = auVar205._4_4_;
    fVar266 = auVar189._4_4_;
    fVar257 = auVar205._8_4_;
    fVar267 = auVar189._8_4_;
    fVar258 = auVar205._12_4_;
    fVar268 = auVar189._12_4_;
    auVar36._28_4_ = auVar96._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar258,
                            CONCAT48(fVar267 * fVar257,CONCAT44(fVar266 * fVar256,fVar263 * fVar248)
                                    )));
    auVar145 = vsubps_avx(ZEXT1632(auVar88),auVar36);
    auVar37._4_4_ = fVar156 * fVar156;
    auVar37._0_4_ = fVar155 * fVar155;
    auVar37._8_4_ = fVar157 * fVar157;
    auVar37._12_4_ = fVar183 * fVar183;
    auVar37._16_4_ = fVar184 * fVar184;
    auVar37._20_4_ = fVar185 * fVar185;
    auVar37._24_4_ = fVar186 * fVar186;
    auVar37._28_4_ = auVar96._28_4_;
    auVar88 = vfmadd231ps_fma(auVar37,auVar14,auVar14);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar98,auVar98);
    local_8a0 = vsubps_avx(ZEXT1632(auVar88),
                           ZEXT1632(CONCAT412(fVar258 * fVar258,
                                              CONCAT48(fVar257 * fVar257,
                                                       CONCAT44(fVar256 * fVar256,fVar248 * fVar248)
                                                      ))));
    fVar262 = local_7e0._28_4_ + auVar147._28_4_;
    fVar248 = (local_7e0._0_4_ + auVar147._0_4_) * 1.0000002;
    fVar256 = (local_7e0._4_4_ + auVar147._4_4_) * 1.0000002;
    fVar257 = (local_7e0._8_4_ + auVar147._8_4_) * 1.0000002;
    fVar258 = (local_7e0._12_4_ + auVar147._12_4_) * 1.0000002;
    fVar259 = (local_7e0._16_4_ + auVar147._16_4_) * 1.0000002;
    fVar260 = (local_7e0._20_4_ + auVar147._20_4_) * 1.0000002;
    fVar261 = (local_7e0._24_4_ + auVar147._24_4_) * 1.0000002;
    auVar38._4_4_ = fVar256 * fVar256;
    auVar38._0_4_ = fVar248 * fVar248;
    auVar38._8_4_ = fVar257 * fVar257;
    auVar38._12_4_ = fVar258 * fVar258;
    auVar38._16_4_ = fVar259 * fVar259;
    auVar38._20_4_ = fVar260 * fVar260;
    auVar38._24_4_ = fVar261 * fVar261;
    auVar38._28_4_ = fVar262;
    local_480._0_4_ = auVar145._0_4_ + auVar145._0_4_;
    local_480._4_4_ = auVar145._4_4_ + auVar145._4_4_;
    local_480._8_4_ = auVar145._8_4_ + auVar145._8_4_;
    local_480._12_4_ = auVar145._12_4_ + auVar145._12_4_;
    local_480._16_4_ = auVar145._16_4_ + auVar145._16_4_;
    local_480._20_4_ = auVar145._20_4_ + auVar145._20_4_;
    local_480._24_4_ = auVar145._24_4_ + auVar145._24_4_;
    local_480._28_4_ = auVar145._28_4_ + auVar145._28_4_;
    auVar145 = vsubps_avx(local_8a0,auVar38);
    local_360 = ZEXT1632(auVar189);
    auVar39._28_4_ = fVar262;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar268,
                            CONCAT48(fVar267 * fVar267,CONCAT44(fVar266 * fVar266,fVar263 * fVar263)
                                    )));
    auVar199 = vsubps_avx(local_280,auVar39);
    local_620._4_4_ = local_480._4_4_ * local_480._4_4_;
    local_620._0_4_ = local_480._0_4_ * local_480._0_4_;
    local_620._8_4_ = local_480._8_4_ * local_480._8_4_;
    local_620._12_4_ = local_480._12_4_ * local_480._12_4_;
    local_620._16_4_ = local_480._16_4_ * local_480._16_4_;
    local_620._20_4_ = local_480._20_4_ * local_480._20_4_;
    local_620._24_4_ = local_480._24_4_ * local_480._24_4_;
    local_620._28_4_ = local_280._28_4_;
    fVar248 = auVar199._0_4_;
    local_640._0_4_ = fVar248 * 4.0;
    fVar256 = auVar199._4_4_;
    local_640._4_4_ = fVar256 * 4.0;
    fVar257 = auVar199._8_4_;
    fStack_638 = fVar257 * 4.0;
    fVar258 = auVar199._12_4_;
    fStack_634 = fVar258 * 4.0;
    fVar259 = auVar199._16_4_;
    fStack_630 = fVar259 * 4.0;
    fVar260 = auVar199._20_4_;
    fStack_62c = fVar260 * 4.0;
    fVar261 = auVar199._24_4_;
    fStack_628 = fVar261 * 4.0;
    fStack_624 = local_7e0._28_4_;
    auVar40._4_4_ = (float)local_640._4_4_ * auVar145._4_4_;
    auVar40._0_4_ = (float)local_640._0_4_ * auVar145._0_4_;
    auVar40._8_4_ = fStack_638 * auVar145._8_4_;
    auVar40._12_4_ = fStack_634 * auVar145._12_4_;
    auVar40._16_4_ = fStack_630 * auVar145._16_4_;
    auVar40._20_4_ = fStack_62c * auVar145._20_4_;
    auVar40._24_4_ = fStack_628 * auVar145._24_4_;
    auVar40._28_4_ = 0x40800000;
    auVar220 = vsubps_avx(local_620,auVar40);
    auVar147 = vcmpps_avx(auVar220,auVar225,5);
    auVar96 = vandps_avx(auVar39,local_6c0);
    local_340._0_4_ = fVar248 + fVar248;
    local_340._4_4_ = fVar256 + fVar256;
    local_340._8_4_ = fVar257 + fVar257;
    local_340._12_4_ = fVar258 + fVar258;
    local_340._16_4_ = fVar259 + fVar259;
    local_340._20_4_ = fVar260 + fVar260;
    local_340._24_4_ = fVar261 + fVar261;
    local_340._28_4_ = auVar199._28_4_ + auVar199._28_4_;
    local_320 = vandps_avx(auVar199,local_6c0);
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      local_980._8_4_ = 0x7f800000;
      local_980._0_8_ = 0x7f8000007f800000;
      local_980._12_4_ = 0x7f800000;
      local_980._16_4_ = 0x7f800000;
      local_980._20_4_ = 0x7f800000;
      local_980._24_4_ = 0x7f800000;
      local_980._28_4_ = 0x7f800000;
      local_ac0._8_4_ = 0xff800000;
      local_ac0._0_8_ = 0xff800000ff800000;
      local_ac0._12_4_ = 0xff800000;
      local_ac0._16_4_ = 0xff800000;
      local_ac0._20_4_ = 0xff800000;
      local_ac0._24_4_ = 0xff800000;
      local_ac0._28_4_ = 0xff800000;
      auVar220 = local_340;
    }
    else {
      auVar95 = vsqrtps_avx(auVar220);
      auVar94 = vrcpps_avx(local_340);
      auVar199 = vcmpps_avx(auVar220,auVar225,5);
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = 0x3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar189 = vfnmadd213ps_fma(auVar94,local_340,auVar226);
      auVar189 = vfmadd132ps_fma(ZEXT1632(auVar189),auVar94,auVar94);
      uVar76 = CONCAT44(local_480._4_4_,local_480._0_4_);
      auVar272._0_8_ = uVar76 ^ 0x8000000080000000;
      auVar272._8_4_ = -local_480._8_4_;
      auVar272._12_4_ = -local_480._12_4_;
      auVar272._16_4_ = -local_480._16_4_;
      auVar272._20_4_ = -local_480._20_4_;
      auVar272._24_4_ = -local_480._24_4_;
      auVar272._28_4_ = -local_480._28_4_;
      auVar220 = vsubps_avx(auVar272,auVar95);
      auVar41._4_4_ = auVar220._4_4_ * auVar189._4_4_;
      auVar41._0_4_ = auVar220._0_4_ * auVar189._0_4_;
      auVar41._8_4_ = auVar220._8_4_ * auVar189._8_4_;
      auVar41._12_4_ = auVar220._12_4_ * auVar189._12_4_;
      auVar41._16_4_ = auVar220._16_4_ * 0.0;
      auVar41._20_4_ = auVar220._20_4_ * 0.0;
      auVar41._24_4_ = auVar220._24_4_ * 0.0;
      auVar41._28_4_ = auVar220._28_4_;
      auVar220 = vsubps_avx(auVar95,local_480);
      auVar42._4_4_ = auVar189._4_4_ * auVar220._4_4_;
      auVar42._0_4_ = auVar189._0_4_ * auVar220._0_4_;
      auVar42._8_4_ = auVar189._8_4_ * auVar220._8_4_;
      auVar42._12_4_ = auVar189._12_4_ * auVar220._12_4_;
      auVar42._16_4_ = auVar220._16_4_ * 0.0;
      auVar42._20_4_ = auVar220._20_4_ * 0.0;
      auVar42._24_4_ = auVar220._24_4_ * 0.0;
      auVar42._28_4_ = auVar220._28_4_;
      local_a80 = ZEXT1632(auVar205);
      auVar189 = vfmadd213ps_fma(local_360,auVar41,local_a80);
      local_460 = fVar136 * auVar189._0_4_;
      fStack_45c = fVar153 * auVar189._4_4_;
      fStack_458 = fVar158 * auVar189._8_4_;
      fStack_454 = fVar154 * auVar189._12_4_;
      uStack_450 = 0;
      uStack_44c = 0;
      uStack_448 = 0;
      uStack_444 = 0x80000000;
      auVar189 = vfmadd213ps_fma(local_360,auVar42,local_a80);
      local_440 = fVar136 * auVar189._0_4_;
      fStack_43c = fVar153 * auVar189._4_4_;
      fStack_438 = fVar158 * auVar189._8_4_;
      fStack_434 = fVar154 * auVar189._12_4_;
      uStack_430 = 0;
      uStack_42c = 0;
      uStack_428 = 0;
      uStack_424 = 0x80000000;
      auVar227._8_4_ = 0x7f800000;
      auVar227._0_8_ = 0x7f8000007f800000;
      auVar227._12_4_ = 0x7f800000;
      auVar227._16_4_ = 0x7f800000;
      auVar227._20_4_ = 0x7f800000;
      auVar227._24_4_ = 0x7f800000;
      auVar227._28_4_ = 0x7f800000;
      local_980 = vblendvps_avx(auVar227,auVar41,auVar199);
      auVar228._8_4_ = 0xff800000;
      auVar228._0_8_ = 0xff800000ff800000;
      auVar228._12_4_ = 0xff800000;
      auVar228._16_4_ = 0xff800000;
      auVar228._20_4_ = 0xff800000;
      auVar228._24_4_ = 0xff800000;
      auVar228._28_4_ = 0xff800000;
      local_ac0 = vblendvps_avx(auVar228,auVar42,auVar199);
      auVar220 = vmaxps_avx(local_500,auVar96);
      auVar43._4_4_ = auVar220._4_4_ * 1.9073486e-06;
      auVar43._0_4_ = auVar220._0_4_ * 1.9073486e-06;
      auVar43._8_4_ = auVar220._8_4_ * 1.9073486e-06;
      auVar43._12_4_ = auVar220._12_4_ * 1.9073486e-06;
      auVar43._16_4_ = auVar220._16_4_ * 1.9073486e-06;
      auVar43._20_4_ = auVar220._20_4_ * 1.9073486e-06;
      auVar43._24_4_ = auVar220._24_4_ * 1.9073486e-06;
      auVar43._28_4_ = auVar220._28_4_;
      auVar220 = vcmpps_avx(local_320,auVar43,1);
      auVar225 = auVar199 & auVar220;
      if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar225 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar225 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar225 >> 0x7f,0) == '\0') &&
            (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar225 >> 0xbf,0) == '\0') &&
          (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar225[0x1f]) {
      }
      else {
        auVar147 = vandps_avx(auVar220,auVar199);
        auVar225 = vcmpps_avx(auVar145,_DAT_01f7b000,2);
        auVar231._8_4_ = 0xff800000;
        auVar231._0_8_ = 0xff800000ff800000;
        auVar231._12_4_ = 0xff800000;
        auVar231._16_4_ = 0xff800000;
        auVar231._20_4_ = 0xff800000;
        auVar231._24_4_ = 0xff800000;
        auVar231._28_4_ = 0xff800000;
        auVar280._8_4_ = 0x7f800000;
        auVar280._0_8_ = 0x7f8000007f800000;
        auVar280._12_4_ = 0x7f800000;
        auVar280._16_4_ = 0x7f800000;
        auVar280._20_4_ = 0x7f800000;
        auVar280._24_4_ = 0x7f800000;
        auVar280._28_4_ = 0x7f800000;
        auVar145 = vblendvps_avx(auVar280,auVar231,auVar225);
        auVar189 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
        auVar220 = vpmovsxwd_avx2(auVar189);
        local_980 = vblendvps_avx(local_980,auVar145,auVar220);
        auVar145 = vblendvps_avx(auVar231,auVar280,auVar225);
        local_ac0 = vblendvps_avx(local_ac0,auVar145,auVar220);
        auVar221._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
        auVar221._8_4_ = auVar147._8_4_ ^ 0xffffffff;
        auVar221._12_4_ = auVar147._12_4_ ^ 0xffffffff;
        auVar221._16_4_ = auVar147._16_4_ ^ 0xffffffff;
        auVar221._20_4_ = auVar147._20_4_ ^ 0xffffffff;
        auVar221._24_4_ = auVar147._24_4_ ^ 0xffffffff;
        auVar221._28_4_ = auVar147._28_4_ ^ 0xffffffff;
        auVar147 = vorps_avx(auVar225,auVar221);
        auVar147 = vandps_avx(auVar199,auVar147);
      }
    }
    local_a80 = ZEXT1632(auVar205);
    auVar255 = ZEXT3264(auVar220);
    auVar145 = local_380 & auVar147;
    if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0x7f,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar145 >> 0xbf,0) == '\0') &&
        (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar145[0x1f])
    {
LAB_013c704e:
      auVar222 = ZEXT3264(local_900);
      auVar242 = ZEXT3264(local_960);
      local_8a0._0_8_ = uVar78;
      fVar248 = (float)local_880._0_4_;
      fVar136 = (float)local_880._4_4_;
      fVar256 = fStack_878;
      fVar153 = fStack_874;
      fVar257 = fStack_870;
      fVar158 = fStack_86c;
      fVar258 = fStack_868;
      fVar154 = fStack_864;
      auVar235 = local_920;
      auVar269 = local_940;
    }
    else {
      local_4a0 = ZEXT1632(auVar4);
      fVar248 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_800._0_4_;
      auVar211._4_4_ = fVar248;
      auVar211._0_4_ = fVar248;
      auVar211._8_4_ = fVar248;
      auVar211._12_4_ = fVar248;
      auVar211._16_4_ = fVar248;
      auVar211._20_4_ = fVar248;
      auVar211._24_4_ = fVar248;
      auVar211._28_4_ = fVar248;
      auVar145 = vmaxps_avx(auVar211,local_980);
      fVar248 = (ray->super_RayK<1>).tfar - (float)local_800._0_4_;
      auVar217._4_4_ = fVar248;
      auVar217._0_4_ = fVar248;
      auVar217._8_4_ = fVar248;
      auVar217._12_4_ = fVar248;
      auVar217._16_4_ = fVar248;
      auVar217._20_4_ = fVar248;
      auVar217._24_4_ = fVar248;
      auVar217._28_4_ = fVar248;
      auVar199 = vminps_avx(auVar217,local_ac0);
      auVar44._4_4_ = fVar156 * fVar130;
      auVar44._0_4_ = fVar155 * fVar107;
      auVar44._8_4_ = fVar157 * fVar131;
      auVar44._12_4_ = fVar183 * fVar132;
      auVar44._16_4_ = fVar184 * fVar133;
      auVar44._20_4_ = fVar185 * fVar134;
      auVar44._24_4_ = fVar186 * fVar135;
      auVar44._28_4_ = auVar15._28_4_;
      auVar4 = vfmadd213ps_fma(auVar14,local_700,auVar44);
      auVar189 = vfmadd213ps_fma(auVar98,local_a20,ZEXT1632(auVar4));
      auVar45._4_4_ = fStack_5fc * fVar130;
      auVar45._0_4_ = local_600 * fVar107;
      auVar45._8_4_ = fStack_5f8 * fVar131;
      auVar45._12_4_ = fStack_5f4 * fVar132;
      auVar45._16_4_ = fStack_5f0 * fVar133;
      auVar45._20_4_ = fStack_5ec * fVar134;
      auVar45._24_4_ = fStack_5e8 * fVar135;
      auVar45._28_4_ = auVar16._28_4_;
      auVar4 = vfmadd231ps_fma(auVar45,_local_5e0,local_700);
      auVar205 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5c0,local_a20);
      auVar15 = vandps_avx(local_6c0,ZEXT1632(auVar205));
      auVar273._8_4_ = 0x219392ef;
      auVar273._0_8_ = 0x219392ef219392ef;
      auVar273._12_4_ = 0x219392ef;
      auVar273._16_4_ = 0x219392ef;
      auVar273._20_4_ = 0x219392ef;
      auVar273._24_4_ = 0x219392ef;
      auVar273._28_4_ = 0x219392ef;
      auVar16 = vcmpps_avx(auVar15,auVar273,1);
      auVar15 = vrcpps_avx(ZEXT1632(auVar205));
      auVar251._8_4_ = 0x3f800000;
      auVar251._0_8_ = 0x3f8000003f800000;
      auVar251._12_4_ = 0x3f800000;
      auVar251._16_4_ = 0x3f800000;
      auVar251._20_4_ = 0x3f800000;
      auVar251._24_4_ = 0x3f800000;
      auVar251._28_4_ = 0x3f800000;
      auVar98 = ZEXT1632(auVar205);
      auVar4 = vfnmadd213ps_fma(auVar15,auVar98,auVar251);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar15,auVar15);
      auVar252._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
      auVar252._8_4_ = auVar205._8_4_ ^ 0x80000000;
      auVar252._12_4_ = auVar205._12_4_ ^ 0x80000000;
      auVar252._16_4_ = 0x80000000;
      auVar252._20_4_ = 0x80000000;
      auVar252._24_4_ = 0x80000000;
      auVar252._28_4_ = 0x80000000;
      auVar46._4_4_ = auVar4._4_4_ * -auVar189._4_4_;
      auVar46._0_4_ = auVar4._0_4_ * -auVar189._0_4_;
      auVar46._8_4_ = auVar4._8_4_ * -auVar189._8_4_;
      auVar46._12_4_ = auVar4._12_4_ * -auVar189._12_4_;
      auVar46._16_4_ = 0x80000000;
      auVar46._20_4_ = 0x80000000;
      auVar46._24_4_ = 0x80000000;
      auVar46._28_4_ = 0x80000000;
      auVar15 = vcmpps_avx(auVar98,auVar252,1);
      auVar15 = vorps_avx(auVar16,auVar15);
      auVar274._8_4_ = 0xff800000;
      auVar274._0_8_ = 0xff800000ff800000;
      auVar274._12_4_ = 0xff800000;
      auVar274._16_4_ = 0xff800000;
      auVar274._20_4_ = 0xff800000;
      auVar274._24_4_ = 0xff800000;
      auVar274._28_4_ = 0xff800000;
      auVar15 = vblendvps_avx(auVar46,auVar274,auVar15);
      auVar14 = vmaxps_avx(auVar145,auVar15);
      auVar15 = vcmpps_avx(auVar98,auVar252,6);
      auVar15 = vorps_avx(auVar16,auVar15);
      auVar253._8_4_ = 0x7f800000;
      auVar253._0_8_ = 0x7f8000007f800000;
      auVar253._12_4_ = 0x7f800000;
      auVar253._16_4_ = 0x7f800000;
      auVar253._20_4_ = 0x7f800000;
      auVar253._24_4_ = 0x7f800000;
      auVar253._28_4_ = 0x7f800000;
      auVar255 = ZEXT3264(auVar253);
      auVar15 = vblendvps_avx(auVar46,auVar253,auVar15);
      auVar98 = vminps_avx(auVar199,auVar15);
      fVar248 = -local_8e0._0_4_;
      fVar256 = -local_8e0._4_4_;
      fVar257 = -local_8e0._8_4_;
      fVar258 = -local_8e0._12_4_;
      fVar259 = -local_8e0._16_4_;
      fVar260 = -local_8e0._20_4_;
      fVar261 = -local_8e0._24_4_;
      auVar180._0_8_ = local_a60._0_8_ ^ 0x8000000080000000;
      auVar180._8_4_ = -local_a60._8_4_;
      auVar180._12_4_ = -local_a60._12_4_;
      auVar180._16_4_ = -local_a60._16_4_;
      auVar180._20_4_ = -local_a60._20_4_;
      auVar180._24_4_ = -local_a60._24_4_;
      auVar180._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,local_8c0);
      auVar16 = vsubps_avx(ZEXT832(0) << 0x20,_local_820);
      auVar47._4_4_ = auVar16._4_4_ * fVar256;
      auVar47._0_4_ = auVar16._0_4_ * fVar248;
      auVar47._8_4_ = auVar16._8_4_ * fVar257;
      auVar47._12_4_ = auVar16._12_4_ * fVar258;
      auVar47._16_4_ = auVar16._16_4_ * fVar259;
      auVar47._20_4_ = auVar16._20_4_ * fVar260;
      auVar47._24_4_ = auVar16._24_4_ * fVar261;
      auVar47._28_4_ = auVar16._28_4_;
      auVar4 = vfmadd231ps_fma(auVar47,auVar180,auVar15);
      auVar197._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
      auVar197._8_4_ = -local_9c0._8_4_;
      auVar197._12_4_ = -local_9c0._12_4_;
      auVar197._16_4_ = -local_9c0._16_4_;
      auVar197._20_4_ = -local_9c0._20_4_;
      auVar197._24_4_ = -local_9c0._24_4_;
      auVar197._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,local_9a0);
      auVar189 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar197,auVar15);
      auVar48._4_4_ = fStack_5fc * fVar256;
      auVar48._0_4_ = local_600 * fVar248;
      auVar48._8_4_ = fStack_5f8 * fVar257;
      auVar48._12_4_ = fStack_5f4 * fVar258;
      auVar48._16_4_ = fStack_5f0 * fVar259;
      auVar48._20_4_ = fStack_5ec * fVar260;
      auVar48._24_4_ = fStack_5e8 * fVar261;
      auVar48._28_4_ = local_8e0._28_4_ ^ 0x80000000;
      auVar4 = vfmadd231ps_fma(auVar48,_local_5e0,auVar180);
      auVar205 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5c0,auVar197);
      auVar15 = vandps_avx(local_6c0,ZEXT1632(auVar205));
      auVar145 = vrcpps_avx(ZEXT1632(auVar205));
      auVar218._8_4_ = 0x219392ef;
      auVar218._0_8_ = 0x219392ef219392ef;
      auVar218._12_4_ = 0x219392ef;
      auVar218._16_4_ = 0x219392ef;
      auVar218._20_4_ = 0x219392ef;
      auVar218._24_4_ = 0x219392ef;
      auVar218._28_4_ = 0x219392ef;
      auVar16 = vcmpps_avx(auVar15,auVar218,1);
      auVar240._8_4_ = 0x3f800000;
      auVar240._0_8_ = 0x3f8000003f800000;
      auVar240._12_4_ = 0x3f800000;
      auVar240._16_4_ = 0x3f800000;
      auVar240._20_4_ = 0x3f800000;
      auVar240._24_4_ = 0x3f800000;
      auVar240._28_4_ = 0x3f800000;
      auVar199 = ZEXT1632(auVar205);
      auVar4 = vfnmadd213ps_fma(auVar145,auVar199,auVar240);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar145,auVar145);
      auVar198._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
      auVar198._8_4_ = auVar205._8_4_ ^ 0x80000000;
      auVar198._12_4_ = auVar205._12_4_ ^ 0x80000000;
      auVar198._16_4_ = 0x80000000;
      auVar198._20_4_ = 0x80000000;
      auVar198._24_4_ = 0x80000000;
      auVar198._28_4_ = 0x80000000;
      auVar49._4_4_ = auVar4._4_4_ * -auVar189._4_4_;
      auVar49._0_4_ = auVar4._0_4_ * -auVar189._0_4_;
      auVar49._8_4_ = auVar4._8_4_ * -auVar189._8_4_;
      auVar49._12_4_ = auVar4._12_4_ * -auVar189._12_4_;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar15 = vcmpps_avx(auVar199,auVar198,1);
      auVar15 = vorps_avx(auVar16,auVar15);
      auVar15 = vblendvps_avx(auVar49,auVar274,auVar15);
      local_6e0 = vmaxps_avx(auVar14,auVar15);
      auVar15 = vcmpps_avx(auVar199,auVar198,6);
      auVar15 = vorps_avx(auVar16,auVar15);
      auVar16 = vblendvps_avx(auVar49,auVar253,auVar15);
      auVar15 = vandps_avx(auVar147,local_380);
      local_560 = vminps_avx(auVar98,auVar16);
      auVar16 = vcmpps_avx(local_6e0,local_560,2);
      auVar14 = auVar15 & auVar16;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar14 >> 0x7f,0) == '\0') &&
            (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar14 >> 0xbf,0) == '\0') &&
          (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar14[0x1f])
      goto LAB_013c704e;
      local_8c0._8_4_ = 0x80000000;
      local_8c0._0_8_ = 0x8000000080000000;
      local_8c0._12_4_ = 0x80000000;
      local_8c0._16_4_ = 0x80000000;
      local_8c0._20_4_ = 0x80000000;
      local_8c0._24_4_ = 0x80000000;
      local_8c0._28_4_ = 0x80000000;
      auVar66._4_4_ = fStack_45c;
      auVar66._0_4_ = local_460;
      auVar66._8_4_ = fStack_458;
      auVar66._12_4_ = fStack_454;
      auVar66._16_4_ = uStack_450;
      auVar66._20_4_ = uStack_44c;
      auVar66._24_4_ = uStack_448;
      auVar66._28_4_ = uStack_444;
      auVar219._8_4_ = 0x3f800000;
      auVar219._0_8_ = 0x3f8000003f800000;
      auVar219._12_4_ = 0x3f800000;
      auVar219._16_4_ = 0x3f800000;
      auVar219._20_4_ = 0x3f800000;
      auVar219._24_4_ = 0x3f800000;
      auVar219._28_4_ = 0x3f800000;
      auVar14 = vminps_avx(auVar66,auVar219);
      auVar64 = ZEXT812(0);
      auVar145 = ZEXT1232(auVar64) << 0x20;
      auVar14 = vmaxps_avx(auVar14,ZEXT1232(auVar64) << 0x20);
      auVar67._4_4_ = fStack_43c;
      auVar67._0_4_ = local_440;
      auVar67._8_4_ = fStack_438;
      auVar67._12_4_ = fStack_434;
      auVar67._16_4_ = uStack_430;
      auVar67._20_4_ = uStack_42c;
      auVar67._24_4_ = uStack_428;
      auVar67._28_4_ = uStack_424;
      auVar98 = vminps_avx(auVar67,auVar219);
      auVar98 = vmaxps_avx(auVar98,ZEXT1232(auVar64) << 0x20);
      auVar50._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar14._28_4_ + 7.0;
      auVar4 = vfmadd213ps_fma(auVar50,local_740,local_720);
      auVar51._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar98._28_4_ + 7.0;
      auVar189 = vfmadd213ps_fma(auVar51,local_740,local_720);
      auVar14 = vminps_avx(local_760,local_780);
      auVar98 = vminps_avx(_local_7a0,local_7c0);
      auVar14 = vminps_avx(auVar14,auVar98);
      auVar14 = vsubps_avx(auVar14,_local_7e0);
      auVar15 = vandps_avx(auVar16,auVar15);
      local_1a0 = ZEXT1632(auVar4);
      local_1c0 = ZEXT1632(auVar189);
      auVar52._4_4_ = auVar14._4_4_ * 0.99999976;
      auVar52._0_4_ = auVar14._0_4_ * 0.99999976;
      auVar52._8_4_ = auVar14._8_4_ * 0.99999976;
      auVar52._12_4_ = auVar14._12_4_ * 0.99999976;
      auVar52._16_4_ = auVar14._16_4_ * 0.99999976;
      auVar52._20_4_ = auVar14._20_4_ * 0.99999976;
      auVar52._24_4_ = auVar14._24_4_ * 0.99999976;
      auVar52._28_4_ = 0x3f7ffffc;
      auVar16 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
      auVar53._4_4_ = auVar16._4_4_ * auVar16._4_4_;
      auVar53._0_4_ = auVar16._0_4_ * auVar16._0_4_;
      auVar53._8_4_ = auVar16._8_4_ * auVar16._8_4_;
      auVar53._12_4_ = auVar16._12_4_ * auVar16._12_4_;
      auVar53._16_4_ = auVar16._16_4_ * auVar16._16_4_;
      auVar53._20_4_ = auVar16._20_4_ * auVar16._20_4_;
      auVar53._24_4_ = auVar16._24_4_ * auVar16._24_4_;
      auVar53._28_4_ = auVar16._28_4_;
      auVar14 = vsubps_avx(local_8a0,auVar53);
      auVar54._4_4_ = auVar14._4_4_ * (float)local_640._4_4_;
      auVar54._0_4_ = auVar14._0_4_ * (float)local_640._0_4_;
      auVar54._8_4_ = auVar14._8_4_ * fStack_638;
      auVar54._12_4_ = auVar14._12_4_ * fStack_634;
      auVar54._16_4_ = auVar14._16_4_ * fStack_630;
      auVar54._20_4_ = auVar14._20_4_ * fStack_62c;
      auVar54._24_4_ = auVar14._24_4_ * fStack_628;
      auVar54._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(local_620,auVar54);
      local_9a0 = vcmpps_avx(auVar16,ZEXT1232(auVar64) << 0x20,5);
      if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0x7f,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9a0 >> 0xbf,0) == '\0') &&
          (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9a0[0x1f]) {
        auVar220 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar209 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar199 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_b60 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar229._8_4_ = 0x7f800000;
        auVar229._0_8_ = 0x7f8000007f800000;
        auVar229._12_4_ = 0x7f800000;
        auVar229._16_4_ = 0x7f800000;
        auVar229._20_4_ = 0x7f800000;
        auVar229._24_4_ = 0x7f800000;
        auVar229._28_4_ = 0x7f800000;
        auVar245._8_4_ = 0xff800000;
        auVar245._0_8_ = 0xff800000ff800000;
        auVar245._12_4_ = 0xff800000;
        auVar245._16_4_ = 0xff800000;
        auVar245._20_4_ = 0xff800000;
        auVar245._24_4_ = 0xff800000;
        auVar245._28_4_ = 0xff800000;
      }
      else {
        auVar145 = vrcpps_avx(local_340);
        auVar181._8_4_ = 0x3f800000;
        auVar181._0_8_ = 0x3f8000003f800000;
        auVar181._12_4_ = 0x3f800000;
        auVar181._16_4_ = 0x3f800000;
        auVar181._20_4_ = 0x3f800000;
        auVar181._24_4_ = 0x3f800000;
        auVar181._28_4_ = 0x3f800000;
        auVar4 = vfnmadd213ps_fma(local_340,auVar145,auVar181);
        auVar199 = vsqrtps_avx(auVar16);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar145,auVar145);
        uVar76 = CONCAT44(local_480._4_4_,local_480._0_4_);
        auVar146._0_8_ = uVar76 ^ 0x8000000080000000;
        auVar146._8_4_ = -local_480._8_4_;
        auVar146._12_4_ = -local_480._12_4_;
        auVar146._16_4_ = -local_480._16_4_;
        auVar146._20_4_ = -local_480._20_4_;
        auVar146._24_4_ = -local_480._24_4_;
        auVar146._28_4_ = -local_480._28_4_;
        auVar145 = vsubps_avx(auVar146,auVar199);
        auVar199 = vsubps_avx(auVar199,local_480);
        fVar107 = auVar145._0_4_ * auVar4._0_4_;
        fVar130 = auVar145._4_4_ * auVar4._4_4_;
        auVar55._4_4_ = fVar130;
        auVar55._0_4_ = fVar107;
        fVar131 = auVar145._8_4_ * auVar4._8_4_;
        auVar55._8_4_ = fVar131;
        fVar132 = auVar145._12_4_ * auVar4._12_4_;
        auVar55._12_4_ = fVar132;
        fVar133 = auVar145._16_4_ * 0.0;
        auVar55._16_4_ = fVar133;
        fVar134 = auVar145._20_4_ * 0.0;
        auVar55._20_4_ = fVar134;
        fVar135 = auVar145._24_4_ * 0.0;
        auVar55._24_4_ = fVar135;
        auVar55._28_4_ = auVar147._28_4_;
        fVar248 = auVar199._0_4_ * auVar4._0_4_;
        fVar256 = auVar199._4_4_ * auVar4._4_4_;
        auVar56._4_4_ = fVar256;
        auVar56._0_4_ = fVar248;
        fVar257 = auVar199._8_4_ * auVar4._8_4_;
        auVar56._8_4_ = fVar257;
        fVar258 = auVar199._12_4_ * auVar4._12_4_;
        auVar56._12_4_ = fVar258;
        fVar259 = auVar199._16_4_ * 0.0;
        auVar56._16_4_ = fVar259;
        fVar260 = auVar199._20_4_ * 0.0;
        auVar56._20_4_ = fVar260;
        fVar261 = auVar199._24_4_ * 0.0;
        auVar56._24_4_ = fVar261;
        auVar56._28_4_ = auVar98._28_4_;
        auVar4 = vfmadd213ps_fma(local_360,auVar55,local_a80);
        auVar189 = vfmadd213ps_fma(local_360,auVar56,local_a80);
        auVar147 = ZEXT1632(CONCAT412(fVar154 * auVar4._12_4_,
                                      CONCAT48(fVar158 * auVar4._8_4_,
                                               CONCAT44(fVar153 * auVar4._4_4_,
                                                        fVar136 * auVar4._0_4_))));
        auVar98 = ZEXT1632(CONCAT412(fVar154 * auVar189._12_4_,
                                     CONCAT48(fVar158 * auVar189._8_4_,
                                              CONCAT44(fVar153 * auVar189._4_4_,
                                                       fVar136 * auVar189._0_4_))));
        auVar4 = vfmadd213ps_fma(local_2e0,auVar147,auVar176);
        auVar189 = vfmadd213ps_fma(local_2e0,auVar98,auVar176);
        auVar205 = vfmadd213ps_fma(local_300,auVar147,local_680);
        auVar88 = vfmadd213ps_fma(local_300,auVar98,local_680);
        auVar213 = vfmadd213ps_fma(auVar147,local_2c0,local_660);
        auVar238 = vfmadd213ps_fma(local_2c0,auVar98,local_660);
        auVar57._4_4_ = fVar130 * (float)local_5c0._4_4_;
        auVar57._0_4_ = fVar107 * (float)local_5c0._0_4_;
        auVar57._8_4_ = fVar131 * fStack_5b8;
        auVar57._12_4_ = fVar132 * fStack_5b4;
        auVar57._16_4_ = fVar133 * fStack_5b0;
        auVar57._20_4_ = fVar134 * fStack_5ac;
        auVar57._24_4_ = fVar135 * fStack_5a8;
        auVar57._28_4_ = 0;
        auVar98 = vsubps_avx(auVar57,ZEXT1632(auVar4));
        auVar200._0_4_ = fVar107 * (float)local_5e0._0_4_;
        auVar200._4_4_ = fVar130 * (float)local_5e0._4_4_;
        auVar200._8_4_ = fVar131 * fStack_5d8;
        auVar200._12_4_ = fVar132 * fStack_5d4;
        auVar200._16_4_ = fVar133 * fStack_5d0;
        auVar200._20_4_ = fVar134 * fStack_5cc;
        auVar200._24_4_ = fVar135 * fStack_5c8;
        auVar200._28_4_ = 0;
        auVar199 = vsubps_avx(auVar200,ZEXT1632(auVar205));
        auVar212._0_4_ = local_600 * fVar107;
        auVar212._4_4_ = fStack_5fc * fVar130;
        auVar212._8_4_ = fStack_5f8 * fVar131;
        auVar212._12_4_ = fStack_5f4 * fVar132;
        auVar212._16_4_ = fStack_5f0 * fVar133;
        auVar212._20_4_ = fStack_5ec * fVar134;
        auVar212._24_4_ = fStack_5e8 * fVar135;
        auVar212._28_4_ = 0;
        auVar147 = vsubps_avx(auVar212,ZEXT1632(auVar213));
        _local_b60 = auVar147._0_28_;
        auVar58._4_4_ = fVar256 * (float)local_5c0._4_4_;
        auVar58._0_4_ = fVar248 * (float)local_5c0._0_4_;
        auVar58._8_4_ = fVar257 * fStack_5b8;
        auVar58._12_4_ = fVar258 * fStack_5b4;
        auVar58._16_4_ = fVar259 * fStack_5b0;
        auVar58._20_4_ = fVar260 * fStack_5ac;
        auVar58._24_4_ = fVar261 * fStack_5a8;
        auVar58._28_4_ = auVar147._28_4_;
        auVar145 = vsubps_avx(auVar58,ZEXT1632(auVar189));
        auVar59._4_4_ = fVar256 * (float)local_5e0._4_4_;
        auVar59._0_4_ = fVar248 * (float)local_5e0._0_4_;
        auVar59._8_4_ = fVar257 * fStack_5d8;
        auVar59._12_4_ = fVar258 * fStack_5d4;
        auVar59._16_4_ = fVar259 * fStack_5d0;
        auVar59._20_4_ = fVar260 * fStack_5cc;
        auVar59._24_4_ = fVar261 * fStack_5c8;
        auVar59._28_4_ = 0;
        auVar220 = vsubps_avx(auVar59,ZEXT1632(auVar88));
        auVar60._4_4_ = fStack_5fc * fVar256;
        auVar60._0_4_ = local_600 * fVar248;
        auVar60._8_4_ = fStack_5f8 * fVar257;
        auVar60._12_4_ = fStack_5f4 * fVar258;
        auVar60._16_4_ = fStack_5f0 * fVar259;
        auVar60._20_4_ = fStack_5ec * fVar260;
        auVar60._24_4_ = fStack_5e8 * fVar261;
        auVar60._28_4_ = 0;
        auVar147 = vsubps_avx(auVar60,ZEXT1632(auVar238));
        auVar209 = auVar147._0_28_;
        auVar147 = vcmpps_avx(auVar16,_DAT_01f7b000,5);
        auVar230._8_4_ = 0x7f800000;
        auVar230._0_8_ = 0x7f8000007f800000;
        auVar230._12_4_ = 0x7f800000;
        auVar230._16_4_ = 0x7f800000;
        auVar230._20_4_ = 0x7f800000;
        auVar230._24_4_ = 0x7f800000;
        auVar230._28_4_ = 0x7f800000;
        auVar229 = vblendvps_avx(auVar230,auVar55,auVar147);
        auVar96 = vmaxps_avx(local_500,auVar96);
        auVar61._4_4_ = auVar96._4_4_ * 1.9073486e-06;
        auVar61._0_4_ = auVar96._0_4_ * 1.9073486e-06;
        auVar61._8_4_ = auVar96._8_4_ * 1.9073486e-06;
        auVar61._12_4_ = auVar96._12_4_ * 1.9073486e-06;
        auVar61._16_4_ = auVar96._16_4_ * 1.9073486e-06;
        auVar61._20_4_ = auVar96._20_4_ * 1.9073486e-06;
        auVar61._24_4_ = auVar96._24_4_ * 1.9073486e-06;
        auVar61._28_4_ = auVar96._28_4_;
        auVar96 = vcmpps_avx(local_320,auVar61,1);
        auVar246._8_4_ = 0xff800000;
        auVar246._0_8_ = 0xff800000ff800000;
        auVar246._12_4_ = 0xff800000;
        auVar246._16_4_ = 0xff800000;
        auVar246._20_4_ = 0xff800000;
        auVar246._24_4_ = 0xff800000;
        auVar246._28_4_ = 0xff800000;
        auVar245 = vblendvps_avx(auVar246,auVar56,auVar147);
        auVar16 = auVar147 & auVar96;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          auVar96 = vandps_avx(auVar96,auVar147);
          auVar14 = vcmpps_avx(auVar14,_DAT_01f7b000,2);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar281._8_4_ = 0x7f800000;
          auVar281._0_8_ = 0x7f8000007f800000;
          auVar281._12_4_ = 0x7f800000;
          auVar281._16_4_ = 0x7f800000;
          auVar281._20_4_ = 0x7f800000;
          auVar281._24_4_ = 0x7f800000;
          auVar281._28_4_ = 0x7f800000;
          auVar16 = vblendvps_avx(auVar281,auVar241,auVar14);
          auVar4 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
          auVar176 = vpmovsxwd_avx2(auVar4);
          auVar229 = vblendvps_avx(auVar229,auVar16,auVar176);
          auVar16 = vblendvps_avx(auVar241,auVar281,auVar14);
          auVar245 = vblendvps_avx(auVar245,auVar16,auVar176);
          auVar237._0_8_ = auVar96._0_8_ ^ 0xffffffffffffffff;
          auVar237._8_4_ = auVar96._8_4_ ^ 0xffffffff;
          auVar237._12_4_ = auVar96._12_4_ ^ 0xffffffff;
          auVar237._16_4_ = auVar96._16_4_ ^ 0xffffffff;
          auVar237._20_4_ = auVar96._20_4_ ^ 0xffffffff;
          auVar237._24_4_ = auVar96._24_4_ ^ 0xffffffff;
          auVar237._28_4_ = auVar96._28_4_ ^ 0xffffffff;
          auVar96 = vorps_avx(auVar14,auVar237);
          local_9a0 = vandps_avx(auVar147,auVar96);
        }
      }
      uVar80 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar254._4_4_ = uVar80;
      auVar254._0_4_ = uVar80;
      auVar254._8_4_ = uVar80;
      auVar254._12_4_ = uVar80;
      auVar254._16_4_ = uVar80;
      auVar254._20_4_ = uVar80;
      auVar254._24_4_ = uVar80;
      auVar254._28_4_ = uVar80;
      auVar255 = ZEXT3264(auVar254);
      uVar80 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar265._4_4_ = uVar80;
      auVar265._0_4_ = uVar80;
      auVar265._8_4_ = uVar80;
      auVar265._12_4_ = uVar80;
      auVar265._16_4_ = uVar80;
      auVar265._20_4_ = uVar80;
      auVar265._24_4_ = uVar80;
      auVar265._28_4_ = uVar80;
      fVar248 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_540 = local_6e0;
      local_520 = vminps_avx(local_560,auVar229);
      _local_580 = vmaxps_avx(local_6e0,auVar245);
      auVar96 = vcmpps_avx(local_6e0,local_520,2);
      local_620 = vandps_avx(auVar96,auVar15);
      auVar96 = vcmpps_avx(_local_580,local_560,2);
      local_7c0 = vandps_avx(auVar96,auVar15);
      auVar96 = vorps_avx(local_7c0,local_620);
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0x7f,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0xbf,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f])
      goto LAB_013c704e;
      _local_7a0 = _local_580;
      local_8a0._0_8_ = uVar78;
      auVar62._4_4_ = fVar248 * auVar209._4_4_;
      auVar62._0_4_ = fVar248 * auVar209._0_4_;
      auVar62._8_4_ = fVar248 * auVar209._8_4_;
      auVar62._12_4_ = fVar248 * auVar209._12_4_;
      auVar62._16_4_ = fVar248 * auVar209._16_4_;
      auVar62._20_4_ = fVar248 * auVar209._20_4_;
      auVar62._24_4_ = fVar248 * auVar209._24_4_;
      auVar62._28_4_ = auVar96._28_4_;
      auVar4 = vfmadd213ps_fma(auVar220,auVar265,auVar62);
      auVar63._4_4_ = fVar248 * (float)local_b60._4_4_;
      auVar63._0_4_ = fVar248 * (float)local_b60._0_4_;
      auVar63._8_4_ = fVar248 * fStack_b58;
      auVar63._12_4_ = fVar248 * fStack_b54;
      auVar63._16_4_ = fVar248 * fStack_b50;
      auVar63._20_4_ = fVar248 * fStack_b4c;
      auVar63._24_4_ = fVar248 * fStack_b48;
      auVar63._28_4_ = auVar96._28_4_;
      auVar189 = vfmadd213ps_fma(auVar199,auVar265,auVar63);
      auVar4 = vfmadd213ps_fma(auVar145,auVar254,ZEXT1632(auVar4));
      auVar102._0_8_ = local_9a0._0_8_ ^ 0xffffffffffffffff;
      auVar102._8_4_ = local_9a0._8_4_ ^ 0xffffffff;
      auVar102._12_4_ = local_9a0._12_4_ ^ 0xffffffff;
      auVar102._16_4_ = local_9a0._16_4_ ^ 0xffffffff;
      auVar102._20_4_ = local_9a0._20_4_ ^ 0xffffffff;
      auVar102._24_4_ = local_9a0._24_4_ ^ 0xffffffff;
      auVar102._28_4_ = local_9a0._28_4_ ^ 0xffffffff;
      auVar96 = vandps_avx(ZEXT1632(auVar4),local_6c0);
      auVar148._8_4_ = 0x3e99999a;
      auVar148._0_8_ = 0x3e99999a3e99999a;
      auVar148._12_4_ = 0x3e99999a;
      auVar148._16_4_ = 0x3e99999a;
      auVar148._20_4_ = 0x3e99999a;
      auVar148._24_4_ = 0x3e99999a;
      auVar148._28_4_ = 0x3e99999a;
      auVar96 = vcmpps_avx(auVar96,auVar148,1);
      local_660 = vorps_avx(auVar96,auVar102);
      auVar4 = vfmadd213ps_fma(auVar98,auVar254,ZEXT1632(auVar189));
      auVar96 = vandps_avx(ZEXT1632(auVar4),local_6c0);
      auVar96 = vcmpps_avx(auVar96,auVar148,1);
      auVar96 = vorps_avx(auVar96,auVar102);
      auVar127._8_4_ = 3;
      auVar127._0_8_ = 0x300000003;
      auVar127._12_4_ = 3;
      auVar127._16_4_ = 3;
      auVar127._20_4_ = 3;
      auVar127._24_4_ = 3;
      auVar127._28_4_ = 3;
      auVar149._8_4_ = 2;
      auVar149._0_8_ = 0x200000002;
      auVar149._12_4_ = 2;
      auVar149._16_4_ = 2;
      auVar149._20_4_ = 2;
      auVar149._24_4_ = 2;
      auVar149._28_4_ = 2;
      auVar96 = vblendvps_avx(auVar149,auVar127,auVar96);
      local_680._4_4_ = local_b6c;
      local_680._0_4_ = local_b6c;
      local_680._8_4_ = local_b6c;
      local_680._12_4_ = local_b6c;
      local_680._16_4_ = local_b6c;
      local_680._20_4_ = local_b6c;
      local_680._24_4_ = local_b6c;
      local_680._28_4_ = local_b6c;
      _local_640 = vpcmpgtd_avx2(auVar96,local_680);
      auVar96 = vpandn_avx2(_local_640,local_620);
      local_7e0._4_4_ = local_6e0._4_4_ + (float)local_880._4_4_;
      local_7e0._0_4_ = local_6e0._0_4_ + (float)local_880._0_4_;
      fStack_7d8 = local_6e0._8_4_ + fStack_878;
      fStack_7d4 = local_6e0._12_4_ + fStack_874;
      fStack_7d0 = local_6e0._16_4_ + fStack_870;
      fStack_7cc = local_6e0._20_4_ + fStack_86c;
      fStack_7c8 = local_6e0._24_4_ + fStack_868;
      fStack_7c4 = local_6e0._28_4_ + fStack_864;
      local_8e0 = auVar17;
      while( true ) {
        local_4c0 = auVar96;
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0x7f,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0xbf,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar96[0x1f]) break;
        auVar128._8_4_ = 0x7f800000;
        auVar128._0_8_ = 0x7f8000007f800000;
        auVar128._12_4_ = 0x7f800000;
        auVar128._16_4_ = 0x7f800000;
        auVar128._20_4_ = 0x7f800000;
        auVar128._24_4_ = 0x7f800000;
        auVar128._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar128,local_6e0,auVar96);
        auVar15 = vshufps_avx(auVar147,auVar147,0xb1);
        auVar15 = vminps_avx(auVar147,auVar15);
        auVar16 = vshufpd_avx(auVar15,auVar15,5);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar16 = vpermpd_avx2(auVar15,0x4e);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar147 = vcmpps_avx(auVar147,auVar15,0);
        auVar15 = auVar96 & auVar147;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar96 = vandps_avx(auVar147,auVar96);
        }
        uVar73 = vmovmskps_avx(auVar96);
        iVar18 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        uVar74 = iVar18 << 2;
        *(undefined4 *)(local_4c0 + uVar74) = 0;
        aVar2 = (ray->super_RayK<1>).dir.field_0;
        local_9a0._0_16_ = (undefined1  [16])aVar2;
        auVar4 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
        uVar73 = *(uint *)(local_1a0 + uVar74);
        uVar74 = *(uint *)(local_540 + uVar74);
        if (auVar4._0_4_ < 0.0) {
          auVar255 = ZEXT1664(auVar255._0_16_);
          fVar248 = sqrtf(auVar4._0_4_);
        }
        else {
          auVar4 = vsqrtss_avx(auVar4,auVar4);
          fVar248 = auVar4._0_4_;
        }
        auVar189 = vminps_avx(local_840._0_16_,local_a90);
        auVar4 = vmaxps_avx(local_840._0_16_,local_a90);
        auVar205 = vminps_avx(local_860._0_16_,_local_aa0);
        auVar88 = vminps_avx(auVar189,auVar205);
        auVar189 = vmaxps_avx(local_860._0_16_,_local_aa0);
        auVar205 = vmaxps_avx(auVar4,auVar189);
        local_9c0._8_4_ = 0x7fffffff;
        local_9c0._0_8_ = 0x7fffffff7fffffff;
        local_9c0._12_4_ = 0x7fffffff;
        auVar4 = vandps_avx(auVar88,local_9c0._0_16_);
        auVar189 = vandps_avx(auVar205,local_9c0._0_16_);
        auVar4 = vmaxps_avx(auVar4,auVar189);
        auVar189 = vmovshdup_avx(auVar4);
        auVar189 = vmaxss_avx(auVar189,auVar4);
        auVar4 = vshufpd_avx(auVar4,auVar4,1);
        auVar4 = vmaxss_avx(auVar4,auVar189);
        local_8c0._0_4_ = auVar4._0_4_ * 1.9073486e-06;
        local_8e0._0_4_ = fVar248 * 1.9073486e-06;
        local_780._0_16_ = vshufps_avx(auVar205,auVar205,0xff);
        auVar4 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar73),0x10);
        auVar247 = ZEXT1664(auVar4);
        lVar82 = 5;
        do {
          do {
            bVar83 = lVar82 == 0;
            lVar82 = lVar82 + -1;
            if (bVar83) goto LAB_013c79c0;
            auVar213 = auVar247._0_16_;
            local_a20._0_16_ = vmovshdup_avx(auVar213);
            fVar257 = 1.0 - local_a20._0_4_;
            auVar4 = vshufps_avx(auVar213,auVar213,0x55);
            fVar248 = auVar4._0_4_;
            auVar110._0_4_ = local_a90._0_4_ * fVar248;
            fVar136 = auVar4._4_4_;
            auVar110._4_4_ = local_a90._4_4_ * fVar136;
            fVar256 = auVar4._8_4_;
            auVar110._8_4_ = local_a90._8_4_ * fVar256;
            fVar153 = auVar4._12_4_;
            auVar110._12_4_ = local_a90._12_4_ * fVar153;
            auVar138._4_4_ = fVar257;
            auVar138._0_4_ = fVar257;
            auVar138._8_4_ = fVar257;
            auVar138._12_4_ = fVar257;
            auVar4 = vfmadd231ps_fma(auVar110,auVar138,local_840._0_16_);
            auVar160._0_4_ = local_860._0_4_ * fVar248;
            auVar160._4_4_ = local_860._4_4_ * fVar136;
            auVar160._8_4_ = local_860._8_4_ * fVar256;
            auVar160._12_4_ = local_860._12_4_ * fVar153;
            auVar189 = vfmadd231ps_fma(auVar160,auVar138,local_a90);
            auVar204._0_4_ = fVar248 * auVar189._0_4_;
            auVar204._4_4_ = fVar136 * auVar189._4_4_;
            auVar204._8_4_ = fVar256 * auVar189._8_4_;
            auVar204._12_4_ = fVar153 * auVar189._12_4_;
            auVar205 = vfmadd231ps_fma(auVar204,auVar138,auVar4);
            auVar111._0_4_ = fVar248 * (float)local_aa0._0_4_;
            auVar111._4_4_ = fVar136 * (float)local_aa0._4_4_;
            auVar111._8_4_ = fVar256 * fStack_a98;
            auVar111._12_4_ = fVar153 * fStack_a94;
            auVar4 = vfmadd231ps_fma(auVar111,auVar138,local_860._0_16_);
            auVar188._0_4_ = fVar248 * auVar4._0_4_;
            auVar188._4_4_ = fVar136 * auVar4._4_4_;
            auVar188._8_4_ = fVar256 * auVar4._8_4_;
            auVar188._12_4_ = fVar153 * auVar4._12_4_;
            auVar189 = vfmadd231ps_fma(auVar188,auVar138,auVar189);
            uVar80 = auVar247._0_4_;
            auVar112._4_4_ = uVar80;
            auVar112._0_4_ = uVar80;
            auVar112._8_4_ = uVar80;
            auVar112._12_4_ = uVar80;
            auVar4 = vfmadd213ps_fma(auVar112,local_9a0._0_16_,_DAT_01f45a50);
            auVar87._0_4_ = fVar248 * auVar189._0_4_;
            auVar87._4_4_ = fVar136 * auVar189._4_4_;
            auVar87._8_4_ = fVar256 * auVar189._8_4_;
            auVar87._12_4_ = fVar153 * auVar189._12_4_;
            auVar88 = vfmadd231ps_fma(auVar87,auVar205,auVar138);
            local_700._0_16_ = auVar88;
            auVar4 = vsubps_avx(auVar4,auVar88);
            _local_820 = auVar4;
            auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
            fVar248 = auVar4._0_4_;
            if (fVar248 < 0.0) {
              local_a40._0_16_ = ZEXT416((uint)fVar257);
              local_a60._0_16_ = auVar205;
              local_ac0._0_16_ = auVar189;
              auVar242._0_4_ = sqrtf(fVar248);
              auVar242._4_60_ = extraout_var;
              auVar247 = ZEXT1664(auVar213);
              auVar88 = auVar242._0_16_;
              auVar189 = local_ac0._0_16_;
              auVar205 = local_a60._0_16_;
              auVar238 = local_a40._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar4,auVar4);
              auVar238 = ZEXT416((uint)fVar257);
            }
            auVar189 = vsubps_avx(auVar189,auVar205);
            auVar223._0_4_ = auVar189._0_4_ * 3.0;
            auVar223._4_4_ = auVar189._4_4_ * 3.0;
            auVar223._8_4_ = auVar189._8_4_ * 3.0;
            auVar223._12_4_ = auVar189._12_4_ * 3.0;
            auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar238,local_a20._0_16_);
            auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a20._0_16_,auVar238);
            fVar136 = auVar238._0_4_ * 6.0;
            fVar256 = auVar189._0_4_ * 6.0;
            fVar153 = auVar205._0_4_ * 6.0;
            fVar257 = local_a20._0_4_ * 6.0;
            auVar161._0_4_ = fVar257 * (float)local_aa0._0_4_;
            auVar161._4_4_ = fVar257 * (float)local_aa0._4_4_;
            auVar161._8_4_ = fVar257 * fStack_a98;
            auVar161._12_4_ = fVar257 * fStack_a94;
            auVar113._4_4_ = fVar153;
            auVar113._0_4_ = fVar153;
            auVar113._8_4_ = fVar153;
            auVar113._12_4_ = fVar153;
            auVar189 = vfmadd132ps_fma(auVar113,auVar161,local_860._0_16_);
            auVar162._4_4_ = fVar256;
            auVar162._0_4_ = fVar256;
            auVar162._8_4_ = fVar256;
            auVar162._12_4_ = fVar256;
            auVar189 = vfmadd132ps_fma(auVar162,auVar189,local_a90);
            auVar205 = vdpps_avx(auVar223,auVar223,0x7f);
            auVar114._4_4_ = fVar136;
            auVar114._0_4_ = fVar136;
            auVar114._8_4_ = fVar136;
            auVar114._12_4_ = fVar136;
            auVar142 = vfmadd132ps_fma(auVar114,auVar189,local_840._0_16_);
            auVar189 = vblendps_avx(auVar205,_DAT_01f45a50,0xe);
            auVar238 = vrsqrtss_avx(auVar189,auVar189);
            fVar153 = auVar205._0_4_;
            fVar136 = auVar238._0_4_;
            auVar238 = vdpps_avx(auVar223,auVar142,0x7f);
            fVar136 = fVar136 * 1.5 + fVar153 * -0.5 * fVar136 * fVar136 * fVar136;
            auVar115._0_4_ = auVar142._0_4_ * fVar153;
            auVar115._4_4_ = auVar142._4_4_ * fVar153;
            auVar115._8_4_ = auVar142._8_4_ * fVar153;
            auVar115._12_4_ = auVar142._12_4_ * fVar153;
            fVar256 = auVar238._0_4_;
            auVar206._0_4_ = auVar223._0_4_ * fVar256;
            auVar206._4_4_ = auVar223._4_4_ * fVar256;
            auVar206._8_4_ = auVar223._8_4_ * fVar256;
            auVar206._12_4_ = auVar223._12_4_ * fVar256;
            auVar238 = vsubps_avx(auVar115,auVar206);
            auVar189 = vrcpss_avx(auVar189,auVar189);
            auVar142 = vfnmadd213ss_fma(auVar189,auVar205,ZEXT416(0x40000000));
            fVar256 = auVar189._0_4_ * auVar142._0_4_;
            auVar189 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                  ZEXT416((uint)(auVar247._0_4_ * (float)local_8e0._0_4_)));
            auVar222 = ZEXT1664(auVar189);
            uVar78 = CONCAT44(auVar223._4_4_,auVar223._0_4_);
            auVar214._0_8_ = uVar78 ^ 0x8000000080000000;
            auVar214._8_4_ = -auVar223._8_4_;
            auVar214._12_4_ = -auVar223._12_4_;
            auVar163._0_4_ = fVar136 * auVar238._0_4_ * fVar256;
            auVar163._4_4_ = fVar136 * auVar238._4_4_ * fVar256;
            auVar163._8_4_ = fVar136 * auVar238._8_4_ * fVar256;
            auVar163._12_4_ = fVar136 * auVar238._12_4_ * fVar256;
            auVar264._0_4_ = auVar223._0_4_ * fVar136;
            auVar264._4_4_ = auVar223._4_4_ * fVar136;
            auVar264._8_4_ = auVar223._8_4_ * fVar136;
            auVar264._12_4_ = auVar223._12_4_ * fVar136;
            local_a20._0_16_ = auVar223;
            local_a40._0_4_ = auVar189._0_4_;
            if (fVar153 < -fVar153) {
              local_a60._0_4_ = auVar88._0_4_;
              local_ac0._0_16_ = auVar214;
              local_980._0_16_ = auVar264;
              local_a80._0_16_ = auVar163;
              fVar136 = sqrtf(fVar153);
              auVar88 = ZEXT416((uint)local_a60._0_4_);
              auVar222 = ZEXT464((uint)local_a40._0_4_);
              auVar163 = local_a80._0_16_;
              auVar214 = local_ac0._0_16_;
              auVar264 = local_980._0_16_;
            }
            else {
              auVar189 = vsqrtss_avx(auVar205,auVar205);
              fVar136 = auVar189._0_4_;
            }
            auVar189 = vdpps_avx(_local_820,auVar264,0x7f);
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar88,auVar222._0_16_);
            auVar205 = vdpps_avx(auVar214,auVar264,0x7f);
            auVar238 = vdpps_avx(_local_820,auVar163,0x7f);
            auVar142 = vdpps_avx(local_9a0._0_16_,auVar264,0x7f);
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_8c0._0_4_ / fVar136)),auVar6);
            fVar136 = auVar205._0_4_ + auVar238._0_4_;
            auVar89._0_4_ = auVar189._0_4_ * auVar189._0_4_;
            auVar89._4_4_ = auVar189._4_4_ * auVar189._4_4_;
            auVar89._8_4_ = auVar189._8_4_ * auVar189._8_4_;
            auVar89._12_4_ = auVar189._12_4_ * auVar189._12_4_;
            auVar205 = vdpps_avx(_local_820,auVar214,0x7f);
            auVar238 = vsubps_avx(auVar4,auVar89);
            auVar88 = vrsqrtss_avx(auVar238,auVar238);
            fVar153 = auVar238._0_4_;
            fVar256 = auVar88._0_4_;
            fVar256 = fVar256 * 1.5 + fVar153 * -0.5 * fVar256 * fVar256 * fVar256;
            auVar88 = vdpps_avx(_local_820,local_9a0._0_16_,0x7f);
            auVar205 = vfnmadd231ss_fma(auVar205,auVar189,ZEXT416((uint)fVar136));
            auVar88 = vfnmadd231ss_fma(auVar88,auVar189,auVar142);
            if (fVar153 < 0.0) {
              local_a60._0_16_ = auVar189;
              local_ac0._0_4_ = auVar6._0_4_;
              local_980._0_16_ = ZEXT416((uint)fVar136);
              local_a80._0_16_ = auVar142;
              local_720._0_16_ = auVar205;
              local_740._0_4_ = fVar256;
              local_760._0_16_ = auVar88;
              fVar153 = sqrtf(fVar153);
              auVar222 = ZEXT464((uint)local_a40._0_4_);
              fVar256 = (float)local_740._0_4_;
              auVar88 = local_760._0_16_;
              auVar205 = local_720._0_16_;
              auVar189 = local_a60._0_16_;
              auVar142 = local_a80._0_16_;
              auVar238 = local_980._0_16_;
              fVar136 = (float)local_ac0._0_4_;
            }
            else {
              auVar238 = vsqrtss_avx(auVar238,auVar238);
              fVar153 = auVar238._0_4_;
              auVar238 = ZEXT416((uint)fVar136);
              fVar136 = auVar6._0_4_;
            }
            auVar255 = ZEXT1664(auVar189);
            auVar6 = vpermilps_avx(local_700._0_16_,0xff);
            fVar153 = fVar153 - auVar6._0_4_;
            auVar6 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
            auVar205 = vfmsub213ss_fma(auVar205,ZEXT416((uint)fVar256),auVar6);
            auVar164._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
            auVar164._8_4_ = auVar142._8_4_ ^ 0x80000000;
            auVar164._12_4_ = auVar142._12_4_ ^ 0x80000000;
            auVar190._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
            auVar190._8_4_ = auVar205._8_4_ ^ 0x80000000;
            auVar190._12_4_ = auVar205._12_4_ ^ 0x80000000;
            auVar139 = ZEXT416((uint)(auVar88._0_4_ * fVar256));
            auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar142._0_4_ * auVar205._0_4_)),auVar238,
                                      auVar139);
            auVar205 = vinsertps_avx(auVar190,auVar139,0x1c);
            uVar80 = auVar88._0_4_;
            auVar191._4_4_ = uVar80;
            auVar191._0_4_ = uVar80;
            auVar191._8_4_ = uVar80;
            auVar191._12_4_ = uVar80;
            auVar205 = vdivps_avx(auVar205,auVar191);
            auVar88 = vinsertps_avx(auVar238,auVar164,0x10);
            auVar88 = vdivps_avx(auVar88,auVar191);
            fVar256 = auVar189._0_4_;
            auVar140._0_4_ = fVar256 * auVar205._0_4_ + fVar153 * auVar88._0_4_;
            auVar140._4_4_ = fVar256 * auVar205._4_4_ + fVar153 * auVar88._4_4_;
            auVar140._8_4_ = fVar256 * auVar205._8_4_ + fVar153 * auVar88._8_4_;
            auVar140._12_4_ = fVar256 * auVar205._12_4_ + fVar153 * auVar88._12_4_;
            auVar88 = vsubps_avx(auVar213,auVar140);
            auVar247 = ZEXT1664(auVar88);
            auVar205 = vandps_avx(auVar189,local_9c0._0_16_);
          } while (fVar136 <= auVar205._0_4_);
          auVar213 = vfmadd231ss_fma(ZEXT416((uint)(auVar222._0_4_ + fVar136)),local_780._0_16_,
                                     ZEXT416(0x36000000));
          auVar205 = vandps_avx(ZEXT416((uint)fVar153),local_9c0._0_16_);
        } while (auVar213._0_4_ <= auVar205._0_4_);
        fVar136 = auVar88._0_4_ + (float)local_800._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar136) &&
           (fVar256 = (ray->super_RayK<1>).tfar, fVar136 <= fVar256)) {
          auVar205 = vmovshdup_avx(auVar88);
          fVar153 = auVar205._0_4_;
          if ((0.0 <= fVar153) && (fVar153 <= 1.0)) {
            auVar4 = vrsqrtss_avx(auVar4,auVar4);
            fVar257 = auVar4._0_4_;
            pGVar8 = (context->scene->geometries).items[uVar81].ptr;
            if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar248 = fVar257 * 1.5 + fVar248 * -0.5 * fVar257 * fVar257 * fVar257;
              auVar165._0_4_ = fVar248 * (float)local_820._0_4_;
              auVar165._4_4_ = fVar248 * (float)local_820._4_4_;
              auVar165._8_4_ = fVar248 * fStack_818;
              auVar165._12_4_ = fVar248 * fStack_814;
              auVar213 = vfmadd213ps_fma(auVar6,auVar165,local_a20._0_16_);
              auVar4 = vshufps_avx(auVar165,auVar165,0xc9);
              auVar205 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
              auVar166._0_4_ = auVar165._0_4_ * auVar205._0_4_;
              auVar166._4_4_ = auVar165._4_4_ * auVar205._4_4_;
              auVar166._8_4_ = auVar165._8_4_ * auVar205._8_4_;
              auVar166._12_4_ = auVar165._12_4_ * auVar205._12_4_;
              auVar88 = vfmsub231ps_fma(auVar166,local_a20._0_16_,auVar4);
              auVar4 = vshufps_avx(auVar88,auVar88,0xc9);
              auVar205 = vshufps_avx(auVar213,auVar213,0xc9);
              auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
              auVar90._0_4_ = auVar213._0_4_ * auVar88._0_4_;
              auVar90._4_4_ = auVar213._4_4_ * auVar88._4_4_;
              auVar90._8_4_ = auVar213._8_4_ * auVar88._8_4_;
              auVar90._12_4_ = auVar213._12_4_ * auVar88._12_4_;
              auVar205 = vfmsub231ps_fma(auVar90,auVar4,auVar205);
              auVar4 = vshufps_avx(auVar205,auVar205,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar136;
                uVar108 = vmovlps_avx(auVar4);
                *(undefined8 *)&(ray->Ng).field_0 = uVar108;
                (ray->Ng).field_0.field_0.z = auVar205._0_4_;
                ray->u = fVar153;
                ray->v = 0.0;
                ray->primID = local_8a0._0_4_;
                ray->geomID = uVar81;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_9f0 = vmovlps_avx(auVar4);
                local_9e8 = auVar205._0_4_;
                local_9e4 = fVar153;
                local_9e0 = 0;
                local_9dc = local_8a0._0_4_;
                local_9d8 = uVar81;
                local_9d4 = context->user->instID[0];
                local_9d0 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar136;
                local_6a0._0_4_ = 0xffffffff;
                local_af8.valid = (int *)local_6a0;
                local_af8.geometryUserPtr = pGVar8->userPtr;
                local_af8.context = context->user;
                local_af8.hit = (RTCHitN *)&local_9f0;
                local_af8.N = 1;
                local_af8.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013c7ad3:
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar255 = ZEXT1664(auVar255._0_16_);
                    (*p_Var13)(&local_af8);
                    if (*local_af8.valid == 0) goto LAB_013c7b70;
                  }
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).components[0] =
                       *(float *)local_af8.hit;
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_af8.hit + 4);
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_af8.hit + 8);
                  *(float *)((long)local_af8.ray + 0x3c) = *(float *)(local_af8.hit + 0xc);
                  *(float *)((long)local_af8.ray + 0x40) = *(float *)(local_af8.hit + 0x10);
                  *(float *)((long)local_af8.ray + 0x44) = *(float *)(local_af8.hit + 0x14);
                  *(float *)((long)local_af8.ray + 0x48) = *(float *)(local_af8.hit + 0x18);
                  *(float *)((long)local_af8.ray + 0x4c) = *(float *)(local_af8.hit + 0x1c);
                  *(float *)((long)local_af8.ray + 0x50) = *(float *)(local_af8.hit + 0x20);
                }
                else {
                  auVar255 = ZEXT1664(auVar189);
                  (*pGVar8->intersectionFilterN)(&local_af8);
                  if (*local_af8.valid != 0) goto LAB_013c7ad3;
LAB_013c7b70:
                  (ray->super_RayK<1>).tfar = fVar256;
                }
              }
            }
          }
        }
LAB_013c79c0:
        fVar248 = (ray->super_RayK<1>).tfar;
        auVar103._4_4_ = fVar248;
        auVar103._0_4_ = fVar248;
        auVar103._8_4_ = fVar248;
        auVar103._12_4_ = fVar248;
        auVar103._16_4_ = fVar248;
        auVar103._20_4_ = fVar248;
        auVar103._24_4_ = fVar248;
        auVar103._28_4_ = fVar248;
        auVar96 = vcmpps_avx(_local_7e0,auVar103,2);
        auVar96 = vandps_avx(auVar96,local_4c0);
      }
      auVar104._0_4_ = (float)local_880._0_4_ + (float)local_7a0._0_4_;
      auVar104._4_4_ = (float)local_880._4_4_ + (float)local_7a0._4_4_;
      auVar104._8_4_ = fStack_878 + fStack_798;
      auVar104._12_4_ = fStack_874 + fStack_794;
      auVar104._16_4_ = fStack_870 + fStack_790;
      auVar104._20_4_ = fStack_86c + fStack_78c;
      auVar104._24_4_ = fStack_868 + fStack_788;
      auVar104._28_4_ = fStack_864 + fStack_784;
      fVar259 = (ray->super_RayK<1>).tfar;
      fVar248 = (ray->super_RayK<1>).tfar;
      auVar150._4_4_ = fVar248;
      auVar150._0_4_ = fVar248;
      auVar150._8_4_ = fVar248;
      auVar150._12_4_ = fVar248;
      auVar150._16_4_ = fVar248;
      auVar150._20_4_ = fVar248;
      auVar150._24_4_ = fVar248;
      auVar150._28_4_ = fVar248;
      auVar96 = vcmpps_avx(auVar104,auVar150,2);
      local_7c0 = vandps_avx(auVar96,local_7c0);
      auVar105._8_4_ = 3;
      auVar105._0_8_ = 0x300000003;
      auVar105._12_4_ = 3;
      auVar105._16_4_ = 3;
      auVar105._20_4_ = 3;
      auVar105._24_4_ = 3;
      auVar105._28_4_ = 3;
      auVar151._8_4_ = 2;
      auVar151._0_8_ = 0x200000002;
      auVar151._12_4_ = 2;
      auVar151._16_4_ = 2;
      auVar151._20_4_ = 2;
      auVar151._24_4_ = 2;
      auVar151._28_4_ = 2;
      auVar96 = vblendvps_avx(auVar151,auVar105,local_660);
      _local_7e0 = vpcmpgtd_avx2(auVar96,local_680);
      auVar96 = vpandn_avx2(_local_7e0,local_7c0);
      local_6e0 = _local_580;
      local_7a0._4_4_ = (float)local_880._4_4_ + (float)local_580._4_4_;
      local_7a0._0_4_ = (float)local_880._0_4_ + (float)local_580._0_4_;
      fStack_798 = fStack_878 + fStack_578;
      fStack_794 = fStack_874 + fStack_574;
      fStack_790 = fStack_870 + fStack_570;
      fStack_78c = fStack_86c + fStack_56c;
      fStack_788 = fStack_868 + fStack_568;
      fStack_784 = fStack_864 + fStack_564;
      auVar247 = ZEXT3264(local_920);
      auVar282 = ZEXT3264(local_940);
      auVar222 = ZEXT3264(local_900);
      auVar242 = ZEXT3264(local_960);
      fVar248 = (float)local_880._0_4_;
      fVar136 = (float)local_880._4_4_;
      fVar256 = fStack_878;
      fVar153 = fStack_874;
      fVar257 = fStack_870;
      fVar158 = fStack_86c;
      fVar258 = fStack_868;
      fVar154 = fStack_864;
      while( true ) {
        local_6a0 = auVar96;
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0x7f,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0xbf,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar96[0x1f]) break;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar129,local_6e0,auVar96);
        auVar15 = vshufps_avx(auVar147,auVar147,0xb1);
        auVar15 = vminps_avx(auVar147,auVar15);
        auVar16 = vshufpd_avx(auVar15,auVar15,5);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar16 = vpermpd_avx2(auVar15,0x4e);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar147 = vcmpps_avx(auVar147,auVar15,0);
        auVar15 = auVar96 & auVar147;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar96 = vandps_avx(auVar147,auVar96);
        }
        uVar73 = vmovmskps_avx(auVar96);
        iVar18 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        uVar74 = iVar18 << 2;
        *(undefined4 *)(local_6a0 + uVar74) = 0;
        aVar2 = (ray->super_RayK<1>).dir.field_0;
        local_9a0._0_16_ = (undefined1  [16])aVar2;
        auVar4 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
        uVar73 = *(uint *)(local_1c0 + uVar74);
        uVar74 = *(uint *)(local_560 + uVar74);
        if (auVar4._0_4_ < 0.0) {
          auVar255 = ZEXT1664(auVar255._0_16_);
          fVar248 = sqrtf(auVar4._0_4_);
          auVar242 = ZEXT3264(local_960);
          auVar222 = ZEXT3264(local_900);
          auVar282 = ZEXT3264(local_940);
          auVar247 = ZEXT3264(local_920);
        }
        else {
          auVar4 = vsqrtss_avx(auVar4,auVar4);
          fVar248 = auVar4._0_4_;
        }
        auVar189 = vminps_avx(local_840._0_16_,local_a90);
        auVar4 = vmaxps_avx(local_840._0_16_,local_a90);
        auVar205 = vminps_avx(local_860._0_16_,_local_aa0);
        auVar88 = vminps_avx(auVar189,auVar205);
        auVar189 = vmaxps_avx(local_860._0_16_,_local_aa0);
        auVar205 = vmaxps_avx(auVar4,auVar189);
        local_ac0._8_4_ = 0x7fffffff;
        local_ac0._0_8_ = 0x7fffffff7fffffff;
        local_ac0._12_4_ = 0x7fffffff;
        auVar4 = vandps_avx(auVar88,local_ac0._0_16_);
        auVar189 = vandps_avx(auVar205,local_ac0._0_16_);
        auVar4 = vmaxps_avx(auVar4,auVar189);
        auVar189 = vmovshdup_avx(auVar4);
        auVar189 = vmaxss_avx(auVar189,auVar4);
        auVar4 = vshufpd_avx(auVar4,auVar4,1);
        auVar4 = vmaxss_avx(auVar4,auVar189);
        local_8c0._0_4_ = auVar4._0_4_ * 1.9073486e-06;
        local_980._0_4_ = fVar248 * 1.9073486e-06;
        local_780._0_16_ = vshufps_avx(auVar205,auVar205,0xff);
        auVar4 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar73),0x10);
        auVar232 = ZEXT1664(auVar4);
        lVar82 = 5;
        do {
          do {
            bVar83 = lVar82 == 0;
            lVar82 = lVar82 + -1;
            if (bVar83) goto LAB_013c83bd;
            auVar213 = auVar232._0_16_;
            local_a20._0_16_ = vmovshdup_avx(auVar213);
            fVar257 = 1.0 - local_a20._0_4_;
            auVar4 = vshufps_avx(auVar213,auVar213,0x55);
            fVar248 = auVar4._0_4_;
            auVar116._0_4_ = local_a90._0_4_ * fVar248;
            fVar136 = auVar4._4_4_;
            auVar116._4_4_ = local_a90._4_4_ * fVar136;
            fVar256 = auVar4._8_4_;
            auVar116._8_4_ = local_a90._8_4_ * fVar256;
            fVar153 = auVar4._12_4_;
            auVar116._12_4_ = local_a90._12_4_ * fVar153;
            auVar141._4_4_ = fVar257;
            auVar141._0_4_ = fVar257;
            auVar141._8_4_ = fVar257;
            auVar141._12_4_ = fVar257;
            auVar4 = vfmadd231ps_fma(auVar116,auVar141,local_840._0_16_);
            auVar167._0_4_ = local_860._0_4_ * fVar248;
            auVar167._4_4_ = local_860._4_4_ * fVar136;
            auVar167._8_4_ = local_860._8_4_ * fVar256;
            auVar167._12_4_ = local_860._12_4_ * fVar153;
            auVar189 = vfmadd231ps_fma(auVar167,auVar141,local_a90);
            auVar207._0_4_ = fVar248 * auVar189._0_4_;
            auVar207._4_4_ = fVar136 * auVar189._4_4_;
            auVar207._8_4_ = fVar256 * auVar189._8_4_;
            auVar207._12_4_ = fVar153 * auVar189._12_4_;
            auVar205 = vfmadd231ps_fma(auVar207,auVar141,auVar4);
            auVar117._0_4_ = fVar248 * (float)local_aa0._0_4_;
            auVar117._4_4_ = fVar136 * (float)local_aa0._4_4_;
            auVar117._8_4_ = fVar256 * fStack_a98;
            auVar117._12_4_ = fVar153 * fStack_a94;
            auVar4 = vfmadd231ps_fma(auVar117,auVar141,local_860._0_16_);
            auVar192._0_4_ = fVar248 * auVar4._0_4_;
            auVar192._4_4_ = fVar136 * auVar4._4_4_;
            auVar192._8_4_ = fVar256 * auVar4._8_4_;
            auVar192._12_4_ = fVar153 * auVar4._12_4_;
            auVar189 = vfmadd231ps_fma(auVar192,auVar141,auVar189);
            uVar80 = auVar232._0_4_;
            auVar118._4_4_ = uVar80;
            auVar118._0_4_ = uVar80;
            auVar118._8_4_ = uVar80;
            auVar118._12_4_ = uVar80;
            auVar4 = vfmadd213ps_fma(auVar118,local_9a0._0_16_,_DAT_01f45a50);
            auVar91._0_4_ = fVar248 * auVar189._0_4_;
            auVar91._4_4_ = fVar136 * auVar189._4_4_;
            auVar91._8_4_ = fVar256 * auVar189._8_4_;
            auVar91._12_4_ = fVar153 * auVar189._12_4_;
            auVar88 = vfmadd231ps_fma(auVar91,auVar205,auVar141);
            local_700._0_16_ = auVar88;
            auVar4 = vsubps_avx(auVar4,auVar88);
            _local_820 = auVar4;
            auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
            fVar248 = auVar4._0_4_;
            if (fVar248 < 0.0) {
              local_a40._0_16_ = ZEXT416((uint)fVar257);
              local_9c0._0_16_ = auVar205;
              local_8e0._0_16_ = auVar189;
              auVar222._0_4_ = sqrtf(fVar248);
              auVar222._4_60_ = extraout_var_00;
              auVar232 = ZEXT1664(auVar213);
              auVar88 = auVar222._0_16_;
              auVar189 = local_8e0._0_16_;
              auVar205 = local_9c0._0_16_;
              auVar238 = local_a40._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar4,auVar4);
              auVar238 = ZEXT416((uint)fVar257);
            }
            auVar189 = vsubps_avx(auVar189,auVar205);
            auVar215._0_4_ = auVar189._0_4_ * 3.0;
            auVar215._4_4_ = auVar189._4_4_ * 3.0;
            auVar215._8_4_ = auVar189._8_4_ * 3.0;
            auVar215._12_4_ = auVar189._12_4_ * 3.0;
            auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar238,local_a20._0_16_);
            auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a20._0_16_,auVar238);
            fVar136 = auVar238._0_4_ * 6.0;
            fVar256 = auVar189._0_4_ * 6.0;
            fVar153 = auVar205._0_4_ * 6.0;
            fVar257 = local_a20._0_4_ * 6.0;
            auVar168._0_4_ = fVar257 * (float)local_aa0._0_4_;
            auVar168._4_4_ = fVar257 * (float)local_aa0._4_4_;
            auVar168._8_4_ = fVar257 * fStack_a98;
            auVar168._12_4_ = fVar257 * fStack_a94;
            auVar119._4_4_ = fVar153;
            auVar119._0_4_ = fVar153;
            auVar119._8_4_ = fVar153;
            auVar119._12_4_ = fVar153;
            auVar189 = vfmadd132ps_fma(auVar119,auVar168,local_860._0_16_);
            auVar169._4_4_ = fVar256;
            auVar169._0_4_ = fVar256;
            auVar169._8_4_ = fVar256;
            auVar169._12_4_ = fVar256;
            auVar189 = vfmadd132ps_fma(auVar169,auVar189,local_a90);
            auVar205 = vdpps_avx(auVar215,auVar215,0x7f);
            auVar120._4_4_ = fVar136;
            auVar120._0_4_ = fVar136;
            auVar120._8_4_ = fVar136;
            auVar120._12_4_ = fVar136;
            auVar142 = vfmadd132ps_fma(auVar120,auVar189,local_840._0_16_);
            auVar189 = vblendps_avx(auVar205,_DAT_01f45a50,0xe);
            auVar238 = vrsqrtss_avx(auVar189,auVar189);
            fVar153 = auVar205._0_4_;
            fVar136 = auVar238._0_4_;
            auVar238 = vdpps_avx(auVar215,auVar142,0x7f);
            fVar136 = fVar136 * 1.5 + fVar153 * -0.5 * fVar136 * fVar136 * fVar136;
            auVar121._0_4_ = auVar142._0_4_ * fVar153;
            auVar121._4_4_ = auVar142._4_4_ * fVar153;
            auVar121._8_4_ = auVar142._8_4_ * fVar153;
            auVar121._12_4_ = auVar142._12_4_ * fVar153;
            fVar256 = auVar238._0_4_;
            auVar208._0_4_ = auVar215._0_4_ * fVar256;
            auVar208._4_4_ = auVar215._4_4_ * fVar256;
            auVar208._8_4_ = auVar215._8_4_ * fVar256;
            auVar208._12_4_ = auVar215._12_4_ * fVar256;
            auVar238 = vsubps_avx(auVar121,auVar208);
            auVar189 = vrcpss_avx(auVar189,auVar189);
            auVar142 = vfnmadd213ss_fma(auVar189,auVar205,ZEXT416(0x40000000));
            fVar256 = auVar189._0_4_ * auVar142._0_4_;
            auVar189 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                  ZEXT416((uint)(auVar232._0_4_ * (float)local_980._0_4_)));
            uVar78 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
            auVar243._0_8_ = uVar78 ^ 0x8000000080000000;
            auVar243._8_4_ = -auVar215._8_4_;
            auVar243._12_4_ = -auVar215._12_4_;
            auVar170._0_4_ = fVar136 * auVar238._0_4_ * fVar256;
            auVar170._4_4_ = fVar136 * auVar238._4_4_ * fVar256;
            auVar170._8_4_ = fVar136 * auVar238._8_4_ * fVar256;
            auVar170._12_4_ = fVar136 * auVar238._12_4_ * fVar256;
            local_a60._0_4_ = auVar215._0_4_ * fVar136;
            local_a60._4_4_ = auVar215._4_4_ * fVar136;
            local_a60._8_4_ = auVar215._8_4_ * fVar136;
            local_a60._12_4_ = auVar215._12_4_ * fVar136;
            local_a20._0_16_ = auVar215;
            local_a40._0_4_ = auVar189._0_4_;
            if (fVar153 < -fVar153) {
              local_9c0._0_4_ = auVar88._0_4_;
              local_8e0._0_16_ = auVar243;
              local_a80._0_16_ = auVar170;
              fVar136 = sqrtf(fVar153);
              auVar88 = ZEXT416((uint)local_9c0._0_4_);
              auVar189 = ZEXT416((uint)local_a40._0_4_);
              auVar170 = local_a80._0_16_;
              auVar243 = local_8e0._0_16_;
            }
            else {
              auVar205 = vsqrtss_avx(auVar205,auVar205);
              fVar136 = auVar205._0_4_;
            }
            local_9c0._0_16_ = vdpps_avx(_local_820,local_a60._0_16_,0x7f);
            auVar142 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar88,auVar189);
            auVar189 = vdpps_avx(auVar243,local_a60._0_16_,0x7f);
            auVar205 = vdpps_avx(_local_820,auVar170,0x7f);
            auVar238 = vdpps_avx(local_9a0._0_16_,local_a60._0_16_,0x7f);
            auVar88 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_8c0._0_4_ / fVar136)),auVar142);
            local_8e0._0_4_ = auVar88._0_4_;
            auVar92._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
            auVar92._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
            auVar92._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
            auVar92._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
            auVar88 = vdpps_avx(_local_820,auVar243,0x7f);
            auVar6 = vsubps_avx(auVar4,auVar92);
            auVar142 = vrsqrtss_avx(auVar6,auVar6);
            fVar256 = auVar6._0_4_;
            fVar136 = auVar142._0_4_;
            fVar136 = fVar136 * 1.5 + fVar256 * -0.5 * fVar136 * fVar136 * fVar136;
            auVar142 = vdpps_avx(_local_820,local_9a0._0_16_,0x7f);
            local_a60._0_16_ = ZEXT416((uint)(auVar189._0_4_ + auVar205._0_4_));
            auVar189 = vfnmadd231ss_fma(auVar88,local_9c0._0_16_,local_a60._0_16_);
            auVar205 = vfnmadd231ss_fma(auVar142,local_9c0._0_16_,auVar238);
            if (fVar256 < 0.0) {
              local_a80._0_16_ = auVar238;
              local_720._0_16_ = auVar189;
              local_740._0_4_ = fVar136;
              local_760._0_16_ = auVar205;
              fVar256 = sqrtf(fVar256);
              fVar136 = (float)local_740._0_4_;
              auVar205 = local_760._0_16_;
              auVar238 = local_a80._0_16_;
              auVar189 = local_720._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar6,auVar6);
              fVar256 = auVar88._0_4_;
            }
            auVar255 = ZEXT1664(auVar4);
            auVar247 = ZEXT3264(local_920);
            auVar282 = ZEXT3264(local_940);
            auVar222 = ZEXT3264(local_900);
            auVar242 = ZEXT3264(local_960);
            auVar88 = vpermilps_avx(local_700._0_16_,0xff);
            fVar256 = fVar256 - auVar88._0_4_;
            auVar88 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
            auVar189 = vfmsub213ss_fma(auVar189,ZEXT416((uint)fVar136),auVar88);
            auVar171._0_8_ = auVar238._0_8_ ^ 0x8000000080000000;
            auVar171._8_4_ = auVar238._8_4_ ^ 0x80000000;
            auVar171._12_4_ = auVar238._12_4_ ^ 0x80000000;
            auVar193._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
            auVar193._8_4_ = auVar189._8_4_ ^ 0x80000000;
            auVar193._12_4_ = auVar189._12_4_ ^ 0x80000000;
            auVar142 = ZEXT416((uint)(auVar205._0_4_ * fVar136));
            auVar205 = vfmsub231ss_fma(ZEXT416((uint)(auVar189._0_4_ * auVar238._0_4_)),
                                       local_a60._0_16_,auVar142);
            auVar189 = vinsertps_avx(auVar193,auVar142,0x1c);
            uVar80 = auVar205._0_4_;
            auVar194._4_4_ = uVar80;
            auVar194._0_4_ = uVar80;
            auVar194._8_4_ = uVar80;
            auVar194._12_4_ = uVar80;
            auVar189 = vdivps_avx(auVar189,auVar194);
            auVar205 = vinsertps_avx(local_a60._0_16_,auVar171,0x10);
            auVar205 = vdivps_avx(auVar205,auVar194);
            fVar136 = local_9c0._0_4_;
            auVar143._0_4_ = fVar136 * auVar189._0_4_ + fVar256 * auVar205._0_4_;
            auVar143._4_4_ = fVar136 * auVar189._4_4_ + fVar256 * auVar205._4_4_;
            auVar143._8_4_ = fVar136 * auVar189._8_4_ + fVar256 * auVar205._8_4_;
            auVar143._12_4_ = fVar136 * auVar189._12_4_ + fVar256 * auVar205._12_4_;
            auVar205 = vsubps_avx(auVar213,auVar143);
            auVar232 = ZEXT1664(auVar205);
            auVar189 = vandps_avx(local_9c0._0_16_,local_ac0._0_16_);
          } while ((float)local_8e0._0_4_ <= auVar189._0_4_);
          auVar213 = vfmadd231ss_fma(ZEXT416((uint)((float)local_8e0._0_4_ + (float)local_a40._0_4_)
                                            ),local_780._0_16_,ZEXT416(0x36000000));
          auVar189 = vandps_avx(ZEXT416((uint)fVar256),local_ac0._0_16_);
        } while (auVar213._0_4_ <= auVar189._0_4_);
        fVar136 = auVar205._0_4_ + (float)local_800._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar136) &&
           (fVar256 = (ray->super_RayK<1>).tfar, fVar136 <= fVar256)) {
          auVar189 = vmovshdup_avx(auVar205);
          fVar153 = auVar189._0_4_;
          if ((0.0 <= fVar153) && (fVar153 <= 1.0)) {
            auVar189 = vrsqrtss_avx(auVar4,auVar4);
            fVar257 = auVar189._0_4_;
            pGVar8 = (context->scene->geometries).items[uVar81].ptr;
            if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar248 = fVar257 * 1.5 + fVar248 * -0.5 * fVar257 * fVar257 * fVar257;
              auVar172._0_4_ = fVar248 * (float)local_820._0_4_;
              auVar172._4_4_ = fVar248 * (float)local_820._4_4_;
              auVar172._8_4_ = fVar248 * fStack_818;
              auVar172._12_4_ = fVar248 * fStack_814;
              auVar213 = vfmadd213ps_fma(auVar88,auVar172,local_a20._0_16_);
              auVar189 = vshufps_avx(auVar172,auVar172,0xc9);
              auVar205 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
              auVar173._0_4_ = auVar172._0_4_ * auVar205._0_4_;
              auVar173._4_4_ = auVar172._4_4_ * auVar205._4_4_;
              auVar173._8_4_ = auVar172._8_4_ * auVar205._8_4_;
              auVar173._12_4_ = auVar172._12_4_ * auVar205._12_4_;
              auVar88 = vfmsub231ps_fma(auVar173,local_a20._0_16_,auVar189);
              auVar189 = vshufps_avx(auVar88,auVar88,0xc9);
              auVar205 = vshufps_avx(auVar213,auVar213,0xc9);
              auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
              auVar93._0_4_ = auVar213._0_4_ * auVar88._0_4_;
              auVar93._4_4_ = auVar213._4_4_ * auVar88._4_4_;
              auVar93._8_4_ = auVar213._8_4_ * auVar88._8_4_;
              auVar93._12_4_ = auVar213._12_4_ * auVar88._12_4_;
              auVar205 = vfmsub231ps_fma(auVar93,auVar189,auVar205);
              auVar189 = vshufps_avx(auVar205,auVar205,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar136;
                uVar108 = vmovlps_avx(auVar189);
                *(undefined8 *)&(ray->Ng).field_0 = uVar108;
                (ray->Ng).field_0.field_0.z = auVar205._0_4_;
                ray->u = fVar153;
                ray->v = 0.0;
                ray->primID = local_8a0._0_4_;
                ray->geomID = uVar81;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_9f0 = vmovlps_avx(auVar189);
                local_9e8 = auVar205._0_4_;
                local_9e4 = fVar153;
                local_9e0 = 0;
                local_9dc = local_8a0._0_4_;
                local_9d8 = uVar81;
                local_9d4 = context->user->instID[0];
                local_9d0 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar136;
                local_ac4 = -1;
                local_af8.valid = &local_ac4;
                local_af8.geometryUserPtr = pGVar8->userPtr;
                local_af8.context = context->user;
                local_af8.hit = (RTCHitN *)&local_9f0;
                local_af8.N = 1;
                local_af8.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013c84f4:
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar255 = ZEXT1664(auVar255._0_16_);
                    (*p_Var13)(&local_af8);
                    auVar242 = ZEXT3264(local_960);
                    auVar222 = ZEXT3264(local_900);
                    auVar282 = ZEXT3264(local_940);
                    auVar247 = ZEXT3264(local_920);
                    if (*local_af8.valid == 0) goto LAB_013c85b5;
                  }
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).components[0] =
                       *(float *)local_af8.hit;
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_af8.hit + 4);
                  (((Vec3f *)((long)local_af8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_af8.hit + 8);
                  *(float *)((long)local_af8.ray + 0x3c) = *(float *)(local_af8.hit + 0xc);
                  *(float *)((long)local_af8.ray + 0x40) = *(float *)(local_af8.hit + 0x10);
                  *(float *)((long)local_af8.ray + 0x44) = *(float *)(local_af8.hit + 0x14);
                  *(float *)((long)local_af8.ray + 0x48) = *(float *)(local_af8.hit + 0x18);
                  *(float *)((long)local_af8.ray + 0x4c) = *(float *)(local_af8.hit + 0x1c);
                  *(float *)((long)local_af8.ray + 0x50) = *(float *)(local_af8.hit + 0x20);
                }
                else {
                  auVar255 = ZEXT1664(auVar4);
                  (*pGVar8->intersectionFilterN)(&local_af8);
                  auVar242 = ZEXT3264(local_960);
                  auVar222 = ZEXT3264(local_900);
                  auVar282 = ZEXT3264(local_940);
                  auVar247 = ZEXT3264(local_920);
                  if (*local_af8.valid != 0) goto LAB_013c84f4;
LAB_013c85b5:
                  (ray->super_RayK<1>).tfar = fVar256;
                }
              }
            }
          }
        }
LAB_013c83bd:
        fVar248 = (ray->super_RayK<1>).tfar;
        auVar106._4_4_ = fVar248;
        auVar106._0_4_ = fVar248;
        auVar106._8_4_ = fVar248;
        auVar106._12_4_ = fVar248;
        auVar106._16_4_ = fVar248;
        auVar106._20_4_ = fVar248;
        auVar106._24_4_ = fVar248;
        auVar106._28_4_ = fVar248;
        fVar259 = (ray->super_RayK<1>).tfar;
        auVar96 = vcmpps_avx(_local_7a0,auVar106,2);
        auVar96 = vandps_avx(auVar96,local_6a0);
        fVar248 = (float)local_880._0_4_;
        fVar136 = (float)local_880._4_4_;
        fVar256 = fStack_878;
        fVar153 = fStack_874;
        fVar257 = fStack_870;
        fVar158 = fStack_86c;
        fVar258 = fStack_868;
        fVar154 = fStack_864;
      }
      auVar152._0_4_ = fVar248 + local_540._0_4_;
      auVar152._4_4_ = fVar136 + local_540._4_4_;
      auVar152._8_4_ = fVar256 + local_540._8_4_;
      auVar152._12_4_ = fVar153 + local_540._12_4_;
      auVar152._16_4_ = fVar257 + local_540._16_4_;
      auVar152._20_4_ = fVar158 + local_540._20_4_;
      auVar152._24_4_ = fVar258 + local_540._24_4_;
      auVar152._28_4_ = fVar154 + local_540._28_4_;
      auVar182._4_4_ = fVar259;
      auVar182._0_4_ = fVar259;
      auVar182._8_4_ = fVar259;
      auVar182._12_4_ = fVar259;
      auVar182._16_4_ = fVar259;
      auVar182._20_4_ = fVar259;
      auVar182._24_4_ = fVar259;
      auVar182._28_4_ = fVar259;
      auVar147 = vcmpps_avx(auVar152,auVar182,2);
      auVar96 = vandps_avx(_local_640,local_620);
      auVar96 = vandps_avx(auVar147,auVar96);
      auVar201._0_4_ = fVar248 + local_580._0_4_;
      auVar201._4_4_ = fVar136 + local_580._4_4_;
      auVar201._8_4_ = fVar256 + local_580._8_4_;
      auVar201._12_4_ = fVar153 + local_580._12_4_;
      auVar201._16_4_ = fVar257 + local_580._16_4_;
      auVar201._20_4_ = fVar158 + local_580._20_4_;
      auVar201._24_4_ = fVar258 + local_580._24_4_;
      auVar201._28_4_ = fVar154 + local_580._28_4_;
      auVar15 = vcmpps_avx(auVar201,auVar182,2);
      auVar147 = vandps_avx(_local_7e0,local_7c0);
      auVar147 = vandps_avx(auVar15,auVar147);
      auVar147 = vorps_avx(auVar96,auVar147);
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0x7f,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0xbf,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar147[0x1f] < '\0') {
        uVar76 = (ulong)uVar77;
        *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar147;
        auVar96 = vblendvps_avx(_local_580,local_540,auVar96);
        *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar96;
        uVar78 = vmovlps_avx(local_590);
        (&uStack_140)[uVar76 * 0xc] = uVar78;
        aiStack_138[uVar76 * 0x18] = local_b6c + 1;
        uVar77 = uVar77 + 1;
      }
      auVar235 = auVar247._0_32_;
      auVar269 = auVar282._0_32_;
    }
    auVar224 = local_3a0;
    fVar259 = (ray->super_RayK<1>).tfar;
    auVar99._4_4_ = fVar259;
    auVar99._0_4_ = fVar259;
    auVar99._8_4_ = fVar259;
    auVar99._12_4_ = fVar259;
    auVar99._16_4_ = fVar259;
    auVar99._20_4_ = fVar259;
    auVar99._24_4_ = fVar259;
    auVar99._28_4_ = fVar259;
    do {
      uVar73 = uVar77;
      if (uVar73 == 0) {
        auVar96 = vcmpps_avx(local_420,auVar99,2);
        uVar81 = vmovmskps_avx(auVar96);
        uVar75 = (ulong)(uVar81 & (uint)uVar75 - 1 & (uint)uVar75);
        auVar247 = ZEXT3264(_DAT_01f7b040);
        goto LAB_013c6153;
      }
      uVar78 = (ulong)(uVar73 - 1);
      lVar82 = uVar78 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar125._0_4_ = fVar248 + auVar96._0_4_;
      auVar125._4_4_ = fVar136 + auVar96._4_4_;
      auVar125._8_4_ = fVar256 + auVar96._8_4_;
      auVar125._12_4_ = fVar153 + auVar96._12_4_;
      auVar125._16_4_ = fVar257 + auVar96._16_4_;
      auVar125._20_4_ = fVar158 + auVar96._20_4_;
      auVar125._24_4_ = fVar258 + auVar96._24_4_;
      auVar125._28_4_ = fVar154 + auVar96._28_4_;
      auVar15 = vcmpps_avx(auVar125,auVar99,2);
      auVar147 = vandps_avx(auVar15,*(undefined1 (*) [32])(auStack_180 + lVar82));
      local_540 = auVar147;
      auVar15 = *(undefined1 (*) [32])(auStack_180 + lVar82) & auVar15;
      uVar77 = uVar73 - 1;
    } while ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar15 >> 0x7f,0) == '\0') &&
               (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar15 >> 0xbf,0) == '\0') &&
             (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar15[0x1f]);
    auVar100._8_4_ = 0x7f800000;
    auVar100._0_8_ = 0x7f8000007f800000;
    auVar100._12_4_ = 0x7f800000;
    auVar100._16_4_ = 0x7f800000;
    auVar100._20_4_ = 0x7f800000;
    auVar100._24_4_ = 0x7f800000;
    auVar100._28_4_ = 0x7f800000;
    auVar96 = vblendvps_avx(auVar100,auVar96,auVar147);
    auVar15 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar15 = vminps_avx(auVar96,auVar15);
    auVar16 = vshufpd_avx(auVar15,auVar15,5);
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar16 = vpermpd_avx2(auVar15,0x4e);
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar96 = vcmpps_avx(auVar96,auVar15,0);
    auVar15 = auVar147 & auVar96;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar147 = vandps_avx(auVar96,auVar147);
    }
    uVar77 = vmovmskps_avx(auVar147);
    iVar18 = 0;
    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
      iVar18 = iVar18 + 1;
    }
    *(undefined4 *)(local_540 + (uint)(iVar18 << 2)) = 0;
    uVar76 = (&uStack_140)[uVar78 * 0xc];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar76;
    local_b6c = aiStack_138[uVar78 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar82) = local_540;
    uVar77 = uVar73 - 1;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar77 = uVar73;
    }
    uVar80 = (undefined4)uVar76;
    auVar126._4_4_ = uVar80;
    auVar126._0_4_ = uVar80;
    auVar126._8_4_ = uVar80;
    auVar126._12_4_ = uVar80;
    auVar126._16_4_ = uVar80;
    auVar126._20_4_ = uVar80;
    auVar126._24_4_ = uVar80;
    auVar126._28_4_ = uVar80;
    auVar4 = vmovshdup_avx(auVar86);
    auVar4 = vsubps_avx(auVar4,auVar86);
    auVar101._0_4_ = auVar4._0_4_;
    auVar101._4_4_ = auVar101._0_4_;
    auVar101._8_4_ = auVar101._0_4_;
    auVar101._12_4_ = auVar101._0_4_;
    auVar101._16_4_ = auVar101._0_4_;
    auVar101._20_4_ = auVar101._0_4_;
    auVar101._24_4_ = auVar101._0_4_;
    auVar101._28_4_ = auVar101._0_4_;
    auVar247 = ZEXT3264(_DAT_01f7b040);
    auVar4 = vfmadd132ps_fma(auVar101,auVar126,_DAT_01f7b040);
    _local_580 = ZEXT1632(auVar4);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_580 + (uint)(iVar18 << 2));
    uVar78 = local_8a0._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }